

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threefishApi.c
# Opt level: O2

void threefishEncryptBlockWords(ThreefishKey_t *keyCtx,uint64_t *in,uint64_t *out)

{
  long lVar1;
  long lVar2;
  u64b_t uVar3;
  u64b_t uVar4;
  u64b_t uVar5;
  u64b_t uVar6;
  u64b_t uVar7;
  u64b_t uVar8;
  u64b_t uVar9;
  u64b_t uVar10;
  u64b_t uVar11;
  u64b_t uVar12;
  u64b_t uVar13;
  u64b_t uVar14;
  u64b_t uVar15;
  u64b_t uVar16;
  u64b_t uVar17;
  u64b_t uVar18;
  u64b_t uVar19;
  u64b_t uVar20;
  u64b_t uVar21;
  u64b_t uVar22;
  ulong uVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  long lVar33;
  ulong uVar34;
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  long lVar38;
  ulong uVar39;
  ulong uVar40;
  ulong uVar41;
  ulong uVar42;
  ulong uVar43;
  ulong uVar44;
  ulong uVar45;
  ulong uVar46;
  ulong uVar47;
  ulong uVar48;
  ulong uVar49;
  ulong uVar50;
  
  uVar3 = keyCtx->stateSize;
  if (uVar3 == 0x400) {
    uVar3 = keyCtx->key[0];
    uVar12 = keyCtx->key[1];
    uVar13 = keyCtx->key[2];
    uVar14 = keyCtx->key[3];
    uVar15 = keyCtx->key[4];
    uVar16 = keyCtx->key[5];
    uVar42 = in[1] + uVar12;
    uVar23 = *in + uVar3 + uVar42;
    uVar39 = (uVar42 * 0x1000000 | uVar42 >> 0x28) ^ uVar23;
    uVar29 = in[3] + uVar14;
    uVar42 = in[2] + uVar13 + uVar29;
    uVar50 = (uVar29 * 0x2000 | uVar29 >> 0x33) ^ uVar42;
    uVar31 = in[5] + uVar16;
    uVar29 = in[4] + uVar15 + uVar31;
    uVar35 = (uVar31 * 0x100 | uVar31 >> 0x38) ^ uVar29;
    uVar17 = keyCtx->key[7];
    uVar32 = in[7] + uVar17;
    uVar18 = keyCtx->key[6];
    uVar31 = in[6] + uVar18 + uVar32;
    uVar49 = (uVar32 << 0x2f | uVar32 >> 0x11) ^ uVar31;
    uVar19 = keyCtx->key[9];
    uVar32 = in[9] + uVar19;
    uVar20 = keyCtx->key[8];
    uVar45 = in[8] + uVar20 + uVar32;
    uVar46 = (uVar32 * 0x100 | uVar32 >> 0x38) ^ uVar45;
    uVar21 = keyCtx->key[0xb];
    uVar32 = in[0xb] + uVar21;
    uVar22 = keyCtx->key[10];
    uVar37 = in[10] + uVar22 + uVar32;
    uVar34 = (uVar32 * 0x20000 | uVar32 >> 0x2f) ^ uVar37;
    uVar4 = keyCtx->key[0xd];
    uVar5 = keyCtx->tweak[0];
    uVar43 = in[0xd] + uVar4 + uVar5;
    uVar6 = keyCtx->key[0xc];
    uVar32 = in[0xc] + uVar6 + uVar43;
    uVar44 = (uVar43 * 0x400000 | uVar43 >> 0x2a) ^ uVar32;
    uVar7 = keyCtx->key[0xf];
    uVar43 = in[0xf] + uVar7;
    uVar8 = keyCtx->key[0xe];
    uVar9 = keyCtx->tweak[1];
    uVar30 = in[0xe] + uVar8 + uVar9 + uVar43;
    uVar43 = (uVar43 << 0x25 | uVar43 >> 0x1b) ^ uVar30;
    uVar23 = uVar23 + uVar46;
    uVar47 = (uVar46 << 0x26 | uVar46 >> 0x1a) ^ uVar23;
    uVar42 = uVar42 + uVar44;
    uVar44 = (uVar44 << 0x13 | uVar44 >> 0x2d) ^ uVar42;
    uVar31 = uVar31 + uVar34;
    uVar46 = (uVar34 << 10 | uVar34 >> 0x36) ^ uVar31;
    uVar29 = uVar29 + uVar43;
    uVar43 = (uVar43 << 0x37 | uVar43 >> 9) ^ uVar29;
    uVar37 = uVar37 + uVar49;
    uVar49 = (uVar49 << 0x31 | uVar49 >> 0xf) ^ uVar37;
    uVar32 = uVar32 + uVar50;
    uVar34 = (uVar50 << 0x12 | uVar50 >> 0x2e) ^ uVar32;
    uVar30 = uVar30 + uVar35;
    uVar36 = (uVar35 << 0x17 | uVar35 >> 0x29) ^ uVar30;
    uVar45 = uVar45 + uVar39;
    uVar35 = (uVar39 << 0x34 | uVar39 >> 0xc) ^ uVar45;
    uVar23 = uVar23 + uVar49;
    uVar50 = (uVar49 << 0x21 | uVar49 >> 0x1f) ^ uVar23;
    uVar31 = uVar31 + uVar35;
    uVar49 = (uVar35 << 0xd | uVar35 >> 0x33) ^ uVar31;
    uVar32 = uVar32 + uVar43;
    uVar43 = (uVar43 << 0x22 | uVar43 >> 0x1e) ^ uVar32;
    uVar30 = uVar30 + uVar44;
    uVar44 = (uVar44 << 0x29 | uVar44 >> 0x17) ^ uVar30;
    uVar23 = uVar23 + uVar43;
    uVar30 = uVar30 + uVar49;
    uVar40 = ((uVar49 << 0x2f | uVar49 >> 0x11) ^ uVar30) + uVar13;
    uVar35 = uVar23 + uVar12 + uVar40;
    uVar31 = uVar31 + uVar44;
    uVar49 = ((uVar44 << 0x30 | uVar44 >> 0x10) ^ uVar31) + uVar8 + uVar9;
    uVar10 = keyCtx->key[0x10];
    uVar11 = keyCtx->tweak[2];
    uVar42 = uVar42 + uVar36;
    uVar39 = (uVar36 << 4 | uVar36 >> 0x3c) ^ uVar42;
    uVar29 = uVar29 + uVar34;
    uVar44 = (uVar34 << 0x33 | uVar34 >> 0xd) ^ uVar29;
    uVar45 = uVar45 + uVar46;
    uVar46 = (uVar46 << 0x3b | uVar46 >> 5) ^ uVar45;
    uVar37 = uVar37 + uVar47;
    uVar47 = (uVar47 << 0x11 | uVar47 >> 0x2f) ^ uVar37;
    uVar42 = uVar42 + uVar46;
    uVar29 = uVar29 + uVar47;
    uVar45 = uVar45 + uVar39;
    uVar37 = uVar37 + uVar44;
    uVar32 = uVar32 + uVar50;
    uVar40 = (uVar40 << 0x29 | uVar40 >> 0x17) ^ uVar35;
    uVar34 = ((uVar44 << 0x10 | uVar44 >> 0x30) ^ uVar37) + uVar15;
    uVar36 = uVar42 + uVar14 + uVar34;
    uVar39 = ((uVar39 << 0x1c | uVar39 >> 0x24) ^ uVar45) + uVar18;
    uVar44 = uVar29 + uVar16 + uVar39;
    uVar34 = (uVar34 * 0x200 | uVar34 >> 0x37) ^ uVar36;
    uVar39 = (uVar39 << 0x25 | uVar39 >> 0x1b) ^ uVar44;
    uVar50 = ((uVar50 << 0x19 | uVar50 >> 0x27) ^ uVar32) + uVar20;
    uVar31 = uVar31 + uVar17 + uVar50;
    uVar29 = ((uVar47 << 0x29 | uVar47 >> 0x17) ^ uVar29) + uVar22;
    uVar41 = uVar45 + uVar19 + uVar29;
    uVar45 = (uVar50 * 0x80000000 | uVar50 >> 0x21) ^ uVar31;
    uVar47 = (uVar29 * 0x1000 | uVar29 >> 0x34) ^ uVar41;
    uVar29 = ((uVar46 << 0x14 | uVar46 >> 0x2c) ^ uVar42) + uVar6;
    uVar42 = uVar37 + uVar21 + uVar29;
    uVar50 = (uVar29 << 0x2f | uVar29 >> 0x11) ^ uVar42;
    uVar29 = uVar32 + uVar4 + uVar49;
    uVar32 = (uVar49 << 0x2c | uVar49 >> 0x14) ^ uVar29;
    uVar23 = uVar10 + ((uVar43 << 5 | uVar43 >> 0x3b) ^ uVar23) + 1;
    uVar46 = uVar30 + uVar11 + uVar7 + uVar23;
    uVar43 = (uVar23 * 0x40000000 | uVar23 >> 0x22) ^ uVar46;
    uVar35 = uVar35 + uVar47;
    uVar47 = (uVar47 << 0x10 | uVar47 >> 0x30) ^ uVar35;
    uVar36 = uVar36 + uVar32;
    uVar23 = (uVar32 << 0x22 | uVar32 >> 0x1e) ^ uVar36;
    uVar31 = uVar31 + uVar50;
    uVar30 = (uVar50 << 0x38 | uVar50 >> 8) ^ uVar31;
    uVar44 = uVar44 + uVar43;
    uVar49 = (uVar43 << 0x33 | uVar43 >> 0xd) ^ uVar44;
    uVar42 = uVar42 + uVar45;
    uVar32 = (uVar45 << 4 | uVar45 >> 0x3c) ^ uVar42;
    uVar29 = uVar29 + uVar34;
    uVar45 = (uVar34 << 0x35 | uVar34 >> 0xb) ^ uVar29;
    uVar46 = uVar46 + uVar39;
    uVar34 = (uVar39 << 0x2a | uVar39 >> 0x16) ^ uVar46;
    uVar41 = uVar41 + uVar40;
    uVar50 = (uVar40 << 0x29 | uVar40 >> 0x17) ^ uVar41;
    uVar35 = uVar35 + uVar32;
    uVar43 = (uVar32 << 0x1f | uVar32 >> 0x21) ^ uVar35;
    uVar31 = uVar31 + uVar50;
    uVar32 = (uVar50 << 0x2e | uVar50 >> 0x12) ^ uVar31;
    uVar29 = uVar29 + uVar49;
    uVar49 = (uVar49 << 0x13 | uVar49 >> 0x2d) ^ uVar29;
    uVar46 = uVar46 + uVar23;
    uVar23 = (uVar23 << 0x2a | uVar23 >> 0x16) ^ uVar46;
    uVar35 = uVar35 + uVar49;
    uVar46 = uVar46 + uVar32;
    uVar39 = ((uVar32 << 0x17 | uVar32 >> 0x29) ^ uVar46) + uVar14;
    uVar50 = uVar35 + uVar13 + uVar39;
    uVar31 = uVar31 + uVar23;
    uVar32 = ((uVar23 << 0x23 | uVar23 >> 0x1d) ^ uVar31) + uVar11 + uVar7;
    uVar36 = uVar36 + uVar34;
    uVar34 = (uVar34 << 0x2c | uVar34 >> 0x14) ^ uVar36;
    uVar44 = uVar44 + uVar45;
    uVar23 = (uVar45 << 0x2f | uVar45 >> 0x11) ^ uVar44;
    uVar41 = uVar41 + uVar30;
    uVar37 = (uVar30 << 0x2c | uVar30 >> 0x14) ^ uVar41;
    uVar42 = uVar42 + uVar47;
    uVar48 = (uVar47 << 0x19 | uVar47 >> 0x27) ^ uVar42;
    uVar36 = uVar36 + uVar37;
    uVar44 = uVar44 + uVar48;
    uVar41 = uVar41 + uVar34;
    uVar42 = uVar42 + uVar23;
    uVar29 = uVar29 + uVar43;
    uVar47 = (uVar39 * 0x1000000 | uVar39 >> 0x28) ^ uVar50;
    uVar23 = ((uVar23 << 0x25 | uVar23 >> 0x1b) ^ uVar42) + uVar16;
    uVar39 = uVar36 + uVar15 + uVar23;
    uVar45 = (uVar23 * 0x2000 | uVar23 >> 0x33) ^ uVar39;
    uVar23 = ((uVar34 << 0x1f | uVar34 >> 0x21) ^ uVar41) + uVar17;
    uVar30 = uVar44 + uVar18 + uVar23;
    uVar40 = (uVar23 * 0x100 | uVar23 >> 0x38) ^ uVar30;
    uVar23 = ((uVar43 << 0x14 | uVar43 >> 0x2c) ^ uVar29) + uVar19;
    uVar34 = uVar31 + uVar20 + uVar23;
    uVar31 = (uVar23 << 0x2f | uVar23 >> 0x11) ^ uVar34;
    uVar23 = ((uVar48 << 0x34 | uVar48 >> 0xc) ^ uVar44) + uVar21;
    uVar41 = uVar41 + uVar22 + uVar23;
    uVar48 = (uVar23 * 0x100 | uVar23 >> 0x38) ^ uVar41;
    uVar43 = ((uVar37 << 0x30 | uVar37 >> 0x10) ^ uVar36) + uVar4;
    uVar44 = uVar42 + uVar6 + uVar43;
    uVar23 = uVar29 + uVar8 + uVar32;
    uVar43 = (uVar43 * 0x20000 | uVar43 >> 0x2f) ^ uVar44;
    uVar42 = (uVar32 * 0x400000 | uVar32 >> 0x2a) ^ uVar23;
    uVar29 = ((uVar49 << 9 | uVar49 >> 0x37) ^ uVar35) + uVar3 + 2;
    uVar46 = uVar46 + uVar5 + uVar10 + uVar29;
    uVar29 = (uVar29 << 0x25 | uVar29 >> 0x1b) ^ uVar46;
    uVar50 = uVar50 + uVar48;
    uVar36 = (uVar48 << 0x26 | uVar48 >> 0x1a) ^ uVar50;
    uVar39 = uVar39 + uVar42;
    uVar42 = (uVar42 << 0x13 | uVar42 >> 0x2d) ^ uVar39;
    uVar34 = uVar34 + uVar43;
    uVar49 = (uVar43 << 10 | uVar43 >> 0x36) ^ uVar34;
    uVar30 = uVar30 + uVar29;
    uVar43 = (uVar29 << 0x37 | uVar29 >> 9) ^ uVar30;
    uVar44 = uVar44 + uVar31;
    uVar29 = (uVar31 << 0x31 | uVar31 >> 0xf) ^ uVar44;
    uVar23 = uVar23 + uVar45;
    uVar32 = (uVar45 << 0x12 | uVar45 >> 0x2e) ^ uVar23;
    uVar46 = uVar46 + uVar40;
    uVar45 = (uVar40 << 0x17 | uVar40 >> 0x29) ^ uVar46;
    uVar41 = uVar41 + uVar47;
    uVar35 = (uVar47 << 0x34 | uVar47 >> 0xc) ^ uVar41;
    uVar50 = uVar50 + uVar29;
    uVar31 = (uVar29 << 0x21 | uVar29 >> 0x1f) ^ uVar50;
    uVar34 = uVar34 + uVar35;
    uVar29 = (uVar35 << 0xd | uVar35 >> 0x33) ^ uVar34;
    uVar23 = uVar23 + uVar43;
    uVar43 = (uVar43 << 0x22 | uVar43 >> 0x1e) ^ uVar23;
    uVar46 = uVar46 + uVar42;
    uVar42 = (uVar42 << 0x29 | uVar42 >> 0x17) ^ uVar46;
    uVar50 = uVar50 + uVar43;
    uVar46 = uVar46 + uVar29;
    uVar35 = ((uVar29 << 0x2f | uVar29 >> 0x11) ^ uVar46) + uVar15;
    uVar37 = uVar50 + uVar14 + uVar35;
    uVar34 = uVar34 + uVar42;
    uVar29 = ((uVar42 << 0x30 | uVar42 >> 0x10) ^ uVar34) + uVar5 + uVar10;
    uVar39 = uVar39 + uVar45;
    uVar45 = (uVar45 << 4 | uVar45 >> 0x3c) ^ uVar39;
    uVar30 = uVar30 + uVar32;
    uVar42 = (uVar32 << 0x33 | uVar32 >> 0xd) ^ uVar30;
    uVar41 = uVar41 + uVar49;
    uVar49 = (uVar49 << 0x3b | uVar49 >> 5) ^ uVar41;
    uVar44 = uVar44 + uVar36;
    uVar47 = (uVar36 << 0x11 | uVar36 >> 0x2f) ^ uVar44;
    uVar39 = uVar39 + uVar49;
    uVar30 = uVar30 + uVar47;
    uVar41 = uVar41 + uVar45;
    uVar44 = uVar44 + uVar42;
    uVar23 = uVar23 + uVar31;
    uVar32 = ((uVar42 << 0x10 | uVar42 >> 0x30) ^ uVar44) + uVar18;
    uVar42 = uVar39 + uVar16 + uVar32;
    uVar40 = (uVar35 << 0x29 | uVar35 >> 0x17) ^ uVar37;
    uVar32 = (uVar32 * 0x200 | uVar32 >> 0x37) ^ uVar42;
    uVar36 = ((uVar45 << 0x1c | uVar45 >> 0x24) ^ uVar41) + uVar20;
    uVar35 = uVar30 + uVar17 + uVar36;
    uVar31 = ((uVar31 << 0x19 | uVar31 >> 0x27) ^ uVar23) + uVar22;
    uVar45 = uVar34 + uVar19 + uVar31;
    uVar36 = (uVar36 << 0x25 | uVar36 >> 0x1b) ^ uVar35;
    uVar31 = (uVar31 * 0x80000000 | uVar31 >> 0x21) ^ uVar45;
    uVar47 = ((uVar47 << 0x29 | uVar47 >> 0x17) ^ uVar30) + uVar6;
    uVar34 = uVar41 + uVar21 + uVar47;
    uVar30 = ((uVar49 << 0x14 | uVar49 >> 0x2c) ^ uVar39) + uVar8;
    uVar49 = uVar44 + uVar4 + uVar30;
    uVar39 = (uVar47 * 0x1000 | uVar47 >> 0x34) ^ uVar34;
    uVar30 = (uVar30 << 0x2f | uVar30 >> 0x11) ^ uVar49;
    uVar23 = uVar23 + uVar7 + uVar29;
    uVar43 = ((uVar43 << 5 | uVar43 >> 0x3b) ^ uVar50) + uVar12 + 3;
    uVar44 = uVar46 + uVar9 + uVar3 + uVar43;
    uVar29 = (uVar29 << 0x2c | uVar29 >> 0x14) ^ uVar23;
    uVar37 = uVar37 + uVar39;
    uVar43 = (uVar43 * 0x40000000 | uVar43 >> 0x22) ^ uVar44;
    uVar42 = uVar42 + uVar29;
    uVar39 = (uVar39 << 0x10 | uVar39 >> 0x30) ^ uVar37;
    uVar45 = uVar45 + uVar30;
    uVar29 = (uVar29 << 0x22 | uVar29 >> 0x1e) ^ uVar42;
    uVar35 = uVar35 + uVar43;
    uVar30 = (uVar30 << 0x38 | uVar30 >> 8) ^ uVar45;
    uVar49 = uVar49 + uVar31;
    uVar43 = (uVar43 << 0x33 | uVar43 >> 0xd) ^ uVar35;
    uVar23 = uVar23 + uVar32;
    uVar31 = (uVar31 << 4 | uVar31 >> 0x3c) ^ uVar49;
    uVar44 = uVar44 + uVar36;
    uVar32 = (uVar32 << 0x35 | uVar32 >> 0xb) ^ uVar23;
    uVar34 = uVar34 + uVar40;
    uVar46 = (uVar36 << 0x2a | uVar36 >> 0x16) ^ uVar44;
    uVar37 = uVar37 + uVar31;
    uVar50 = (uVar40 << 0x29 | uVar40 >> 0x17) ^ uVar34;
    uVar45 = uVar45 + uVar50;
    uVar31 = (uVar31 << 0x1f | uVar31 >> 0x21) ^ uVar37;
    uVar23 = uVar23 + uVar43;
    uVar50 = (uVar50 << 0x2e | uVar50 >> 0x12) ^ uVar45;
    uVar44 = uVar44 + uVar29;
    uVar43 = (uVar43 << 0x13 | uVar43 >> 0x2d) ^ uVar23;
    uVar37 = uVar37 + uVar43;
    uVar29 = (uVar29 << 0x2a | uVar29 >> 0x16) ^ uVar44;
    uVar45 = uVar45 + uVar29;
    uVar44 = uVar44 + uVar50;
    uVar36 = ((uVar50 << 0x17 | uVar50 >> 0x29) ^ uVar44) + uVar16;
    uVar50 = uVar37 + uVar15 + uVar36;
    uVar29 = ((uVar29 << 0x23 | uVar29 >> 0x1d) ^ uVar45) + uVar9 + uVar3;
    uVar42 = uVar42 + uVar46;
    uVar46 = (uVar46 << 0x2c | uVar46 >> 0x14) ^ uVar42;
    uVar35 = uVar35 + uVar32;
    uVar32 = (uVar32 << 0x2f | uVar32 >> 0x11) ^ uVar35;
    uVar34 = uVar34 + uVar30;
    uVar30 = (uVar30 << 0x2c | uVar30 >> 0x14) ^ uVar34;
    uVar49 = uVar49 + uVar39;
    uVar41 = (uVar39 << 0x19 | uVar39 >> 0x27) ^ uVar49;
    uVar42 = uVar42 + uVar30;
    uVar35 = uVar35 + uVar41;
    uVar34 = uVar34 + uVar46;
    uVar49 = uVar49 + uVar32;
    uVar23 = uVar23 + uVar31;
    uVar47 = (uVar36 * 0x1000000 | uVar36 >> 0x28) ^ uVar50;
    uVar32 = ((uVar32 << 0x25 | uVar32 >> 0x1b) ^ uVar49) + uVar17;
    uVar36 = uVar42 + uVar18 + uVar32;
    uVar39 = ((uVar46 << 0x1f | uVar46 >> 0x21) ^ uVar34) + uVar19;
    uVar46 = uVar35 + uVar20 + uVar39;
    uVar32 = (uVar32 * 0x2000 | uVar32 >> 0x33) ^ uVar36;
    uVar39 = (uVar39 * 0x100 | uVar39 >> 0x38) ^ uVar46;
    uVar31 = ((uVar31 << 0x14 | uVar31 >> 0x2c) ^ uVar23) + uVar21;
    uVar40 = uVar45 + uVar22 + uVar31;
    uVar45 = ((uVar41 << 0x34 | uVar41 >> 0xc) ^ uVar35) + uVar4;
    uVar34 = uVar34 + uVar6 + uVar45;
    uVar31 = (uVar31 << 0x2f | uVar31 >> 0x11) ^ uVar40;
    uVar35 = (uVar45 * 0x100 | uVar45 >> 0x38) ^ uVar34;
    uVar42 = ((uVar30 << 0x30 | uVar30 >> 0x10) ^ uVar42) + uVar7;
    uVar45 = uVar49 + uVar8 + uVar42;
    uVar49 = (uVar42 * 0x20000 | uVar42 >> 0x2f) ^ uVar45;
    uVar23 = uVar23 + uVar10 + uVar29;
    uVar42 = (uVar29 * 0x400000 | uVar29 >> 0x2a) ^ uVar23;
    uVar29 = ((uVar43 << 9 | uVar43 >> 0x37) ^ uVar37) + uVar13 + 4;
    uVar41 = uVar44 + uVar12 + uVar11 + uVar29;
    uVar29 = (uVar29 << 0x25 | uVar29 >> 0x1b) ^ uVar41;
    uVar50 = uVar50 + uVar35;
    uVar35 = (uVar35 << 0x26 | uVar35 >> 0x1a) ^ uVar50;
    uVar36 = uVar36 + uVar42;
    uVar42 = (uVar42 << 0x13 | uVar42 >> 0x2d) ^ uVar36;
    uVar40 = uVar40 + uVar49;
    uVar44 = (uVar49 << 10 | uVar49 >> 0x36) ^ uVar40;
    uVar46 = uVar46 + uVar29;
    uVar43 = (uVar29 << 0x37 | uVar29 >> 9) ^ uVar46;
    uVar45 = uVar45 + uVar31;
    uVar29 = (uVar31 << 0x31 | uVar31 >> 0xf) ^ uVar45;
    uVar23 = uVar23 + uVar32;
    uVar31 = (uVar32 << 0x12 | uVar32 >> 0x2e) ^ uVar23;
    uVar41 = uVar41 + uVar39;
    uVar49 = (uVar39 << 0x17 | uVar39 >> 0x29) ^ uVar41;
    uVar34 = uVar34 + uVar47;
    uVar32 = (uVar47 << 0x34 | uVar47 >> 0xc) ^ uVar34;
    uVar50 = uVar50 + uVar29;
    uVar29 = (uVar29 << 0x21 | uVar29 >> 0x1f) ^ uVar50;
    uVar40 = uVar40 + uVar32;
    uVar30 = (uVar32 << 0xd | uVar32 >> 0x33) ^ uVar40;
    uVar23 = uVar23 + uVar43;
    uVar32 = (uVar43 << 0x22 | uVar43 >> 0x1e) ^ uVar23;
    uVar41 = uVar41 + uVar42;
    uVar42 = (uVar42 << 0x29 | uVar42 >> 0x17) ^ uVar41;
    uVar50 = uVar50 + uVar32;
    uVar41 = uVar41 + uVar30;
    uVar30 = ((uVar30 << 0x2f | uVar30 >> 0x11) ^ uVar41) + uVar18;
    uVar43 = uVar50 + uVar16 + uVar30;
    uVar40 = uVar40 + uVar42;
    uVar42 = ((uVar42 << 0x30 | uVar42 >> 0x10) ^ uVar40) + uVar12 + uVar11;
    uVar36 = uVar36 + uVar49;
    uVar49 = (uVar49 << 4 | uVar49 >> 0x3c) ^ uVar36;
    uVar46 = uVar46 + uVar31;
    uVar31 = (uVar31 << 0x33 | uVar31 >> 0xd) ^ uVar46;
    uVar34 = uVar34 + uVar44;
    uVar39 = (uVar44 << 0x3b | uVar44 >> 5) ^ uVar34;
    uVar45 = uVar45 + uVar35;
    uVar48 = (uVar35 << 0x11 | uVar35 >> 0x2f) ^ uVar45;
    uVar36 = uVar36 + uVar39;
    uVar46 = uVar46 + uVar48;
    uVar34 = uVar34 + uVar49;
    uVar45 = uVar45 + uVar31;
    uVar23 = uVar23 + uVar29;
    uVar47 = (uVar30 << 0x29 | uVar30 >> 0x17) ^ uVar43;
    uVar31 = ((uVar31 << 0x10 | uVar31 >> 0x30) ^ uVar45) + uVar20;
    uVar35 = uVar36 + uVar17 + uVar31;
    uVar31 = (uVar31 * 0x200 | uVar31 >> 0x37) ^ uVar35;
    uVar49 = ((uVar49 << 0x1c | uVar49 >> 0x24) ^ uVar34) + uVar22;
    uVar44 = uVar46 + uVar19 + uVar49;
    uVar37 = (uVar49 << 0x25 | uVar49 >> 0x1b) ^ uVar44;
    uVar29 = ((uVar29 << 0x19 | uVar29 >> 0x27) ^ uVar23) + uVar6;
    uVar30 = uVar40 + uVar21 + uVar29;
    uVar29 = (uVar29 * 0x80000000 | uVar29 >> 0x21) ^ uVar30;
    uVar46 = ((uVar48 << 0x29 | uVar48 >> 0x17) ^ uVar46) + uVar8;
    uVar49 = uVar34 + uVar4 + uVar46;
    uVar46 = (uVar46 * 0x1000 | uVar46 >> 0x34) ^ uVar49;
    uVar34 = ((uVar39 << 0x14 | uVar39 >> 0x2c) ^ uVar36) + uVar10;
    uVar45 = uVar45 + uVar7 + uVar34;
    uVar23 = uVar23 + uVar3 + uVar42;
    uVar34 = (uVar34 << 0x2f | uVar34 >> 0x11) ^ uVar45;
    uVar42 = (uVar42 << 0x2c | uVar42 >> 0x14) ^ uVar23;
    uVar32 = ((uVar32 << 5 | uVar32 >> 0x3b) ^ uVar50) + uVar14 + 5;
    uVar40 = uVar41 + uVar5 + uVar13 + uVar32;
    uVar32 = (uVar32 * 0x40000000 | uVar32 >> 0x22) ^ uVar40;
    uVar43 = uVar43 + uVar46;
    uVar41 = (uVar46 << 0x10 | uVar46 >> 0x30) ^ uVar43;
    uVar35 = uVar35 + uVar42;
    uVar42 = (uVar42 << 0x22 | uVar42 >> 0x1e) ^ uVar35;
    uVar30 = uVar30 + uVar34;
    uVar34 = (uVar34 << 0x38 | uVar34 >> 8) ^ uVar30;
    uVar44 = uVar44 + uVar32;
    uVar32 = (uVar32 << 0x33 | uVar32 >> 0xd) ^ uVar44;
    uVar45 = uVar45 + uVar29;
    uVar29 = (uVar29 << 4 | uVar29 >> 0x3c) ^ uVar45;
    uVar23 = uVar23 + uVar31;
    uVar31 = (uVar31 << 0x35 | uVar31 >> 0xb) ^ uVar23;
    uVar40 = uVar40 + uVar37;
    uVar46 = (uVar37 << 0x2a | uVar37 >> 0x16) ^ uVar40;
    uVar49 = uVar49 + uVar47;
    uVar50 = (uVar47 << 0x29 | uVar47 >> 0x17) ^ uVar49;
    uVar43 = uVar43 + uVar29;
    uVar29 = (uVar29 << 0x1f | uVar29 >> 0x21) ^ uVar43;
    uVar30 = uVar30 + uVar50;
    uVar50 = (uVar50 << 0x2e | uVar50 >> 0x12) ^ uVar30;
    uVar23 = uVar23 + uVar32;
    uVar32 = (uVar32 << 0x13 | uVar32 >> 0x2d) ^ uVar23;
    uVar40 = uVar40 + uVar42;
    uVar42 = (uVar42 << 0x2a | uVar42 >> 0x16) ^ uVar40;
    uVar43 = uVar43 + uVar32;
    uVar40 = uVar40 + uVar50;
    uVar37 = ((uVar50 << 0x17 | uVar50 >> 0x29) ^ uVar40) + uVar17;
    uVar50 = uVar43 + uVar18 + uVar37;
    uVar30 = uVar30 + uVar42;
    uVar42 = ((uVar42 << 0x23 | uVar42 >> 0x1d) ^ uVar30) + uVar5 + uVar13;
    uVar35 = uVar35 + uVar46;
    uVar39 = (uVar46 << 0x2c | uVar46 >> 0x14) ^ uVar35;
    uVar44 = uVar44 + uVar31;
    uVar31 = (uVar31 << 0x2f | uVar31 >> 0x11) ^ uVar44;
    uVar49 = uVar49 + uVar34;
    uVar36 = (uVar34 << 0x2c | uVar34 >> 0x14) ^ uVar49;
    uVar45 = uVar45 + uVar41;
    uVar41 = (uVar41 << 0x19 | uVar41 >> 0x27) ^ uVar45;
    uVar35 = uVar35 + uVar36;
    uVar44 = uVar44 + uVar41;
    uVar49 = uVar49 + uVar39;
    uVar45 = uVar45 + uVar31;
    uVar23 = uVar23 + uVar29;
    uVar31 = ((uVar31 << 0x25 | uVar31 >> 0x1b) ^ uVar45) + uVar19;
    uVar46 = uVar35 + uVar20 + uVar31;
    uVar47 = (uVar37 * 0x1000000 | uVar37 >> 0x28) ^ uVar50;
    uVar31 = (uVar31 * 0x2000 | uVar31 >> 0x33) ^ uVar46;
    uVar39 = ((uVar39 << 0x1f | uVar39 >> 0x21) ^ uVar49) + uVar21;
    uVar37 = uVar44 + uVar22 + uVar39;
    uVar29 = ((uVar29 << 0x14 | uVar29 >> 0x2c) ^ uVar23) + uVar4;
    uVar34 = uVar30 + uVar6 + uVar29;
    uVar30 = (uVar39 * 0x100 | uVar39 >> 0x38) ^ uVar37;
    uVar29 = (uVar29 << 0x2f | uVar29 >> 0x11) ^ uVar34;
    uVar41 = ((uVar41 << 0x34 | uVar41 >> 0xc) ^ uVar44) + uVar7;
    uVar44 = uVar49 + uVar8 + uVar41;
    uVar49 = ((uVar36 << 0x30 | uVar36 >> 0x10) ^ uVar35) + uVar3;
    uVar39 = uVar45 + uVar10 + uVar49;
    uVar35 = (uVar41 * 0x100 | uVar41 >> 0x38) ^ uVar44;
    uVar45 = (uVar49 * 0x20000 | uVar49 >> 0x2f) ^ uVar39;
    uVar23 = uVar23 + uVar12 + uVar42;
    uVar32 = ((uVar32 << 9 | uVar32 >> 0x37) ^ uVar43) + uVar15 + 6;
    uVar43 = uVar40 + uVar14 + uVar9 + uVar32;
    uVar42 = (uVar42 * 0x400000 | uVar42 >> 0x2a) ^ uVar23;
    uVar50 = uVar50 + uVar35;
    uVar32 = (uVar32 << 0x25 | uVar32 >> 0x1b) ^ uVar43;
    uVar46 = uVar46 + uVar42;
    uVar36 = (uVar35 << 0x26 | uVar35 >> 0x1a) ^ uVar50;
    uVar34 = uVar34 + uVar45;
    uVar42 = (uVar42 << 0x13 | uVar42 >> 0x2d) ^ uVar46;
    uVar37 = uVar37 + uVar32;
    uVar45 = (uVar45 << 10 | uVar45 >> 0x36) ^ uVar34;
    uVar39 = uVar39 + uVar29;
    uVar32 = (uVar32 << 0x37 | uVar32 >> 9) ^ uVar37;
    uVar23 = uVar23 + uVar31;
    uVar29 = (uVar29 << 0x31 | uVar29 >> 0xf) ^ uVar39;
    uVar43 = uVar43 + uVar30;
    uVar31 = (uVar31 << 0x12 | uVar31 >> 0x2e) ^ uVar23;
    uVar44 = uVar44 + uVar47;
    uVar49 = (uVar30 << 0x17 | uVar30 >> 0x29) ^ uVar43;
    uVar50 = uVar50 + uVar29;
    uVar30 = (uVar47 << 0x34 | uVar47 >> 0xc) ^ uVar44;
    uVar34 = uVar34 + uVar30;
    uVar29 = (uVar29 << 0x21 | uVar29 >> 0x1f) ^ uVar50;
    uVar23 = uVar23 + uVar32;
    uVar30 = (uVar30 << 0xd | uVar30 >> 0x33) ^ uVar34;
    uVar43 = uVar43 + uVar42;
    uVar32 = (uVar32 << 0x22 | uVar32 >> 0x1e) ^ uVar23;
    uVar50 = uVar50 + uVar32;
    uVar42 = (uVar42 << 0x29 | uVar42 >> 0x17) ^ uVar43;
    uVar34 = uVar34 + uVar42;
    uVar43 = uVar43 + uVar30;
    uVar35 = ((uVar30 << 0x2f | uVar30 >> 0x11) ^ uVar43) + uVar20;
    uVar40 = uVar50 + uVar35 + uVar17;
    uVar42 = ((uVar42 << 0x30 | uVar42 >> 0x10) ^ uVar34) + uVar14 + uVar9;
    uVar46 = uVar46 + uVar49;
    uVar30 = (uVar49 << 4 | uVar49 >> 0x3c) ^ uVar46;
    uVar37 = uVar37 + uVar31;
    uVar31 = (uVar31 << 0x33 | uVar31 >> 0xd) ^ uVar37;
    uVar44 = uVar44 + uVar45;
    uVar49 = (uVar45 << 0x3b | uVar45 >> 5) ^ uVar44;
    uVar39 = uVar39 + uVar36;
    uVar48 = (uVar36 << 0x11 | uVar36 >> 0x2f) ^ uVar39;
    uVar46 = uVar46 + uVar49;
    uVar37 = uVar37 + uVar48;
    uVar44 = uVar44 + uVar30;
    uVar39 = uVar39 + uVar31;
    uVar23 = uVar23 + uVar29;
    uVar47 = (uVar35 << 0x29 | uVar35 >> 0x17) ^ uVar40;
    uVar31 = ((uVar31 << 0x10 | uVar31 >> 0x30) ^ uVar39) + uVar22;
    uVar45 = uVar46 + uVar19 + uVar31;
    uVar30 = ((uVar30 << 0x1c | uVar30 >> 0x24) ^ uVar44) + uVar6;
    uVar41 = uVar37 + uVar21 + uVar30;
    uVar31 = (uVar31 * 0x200 | uVar31 >> 0x37) ^ uVar45;
    uVar36 = (uVar30 << 0x25 | uVar30 >> 0x1b) ^ uVar41;
    uVar29 = ((uVar29 << 0x19 | uVar29 >> 0x27) ^ uVar23) + uVar8;
    uVar35 = uVar34 + uVar4 + uVar29;
    uVar34 = ((uVar48 << 0x29 | uVar48 >> 0x17) ^ uVar37) + uVar10;
    uVar30 = uVar44 + uVar7 + uVar34;
    uVar29 = (uVar29 * 0x80000000 | uVar29 >> 0x21) ^ uVar35;
    uVar37 = (uVar34 * 0x1000 | uVar34 >> 0x34) ^ uVar30;
    uVar44 = ((uVar49 << 0x14 | uVar49 >> 0x2c) ^ uVar46) + uVar12;
    uVar34 = uVar39 + uVar3 + uVar44;
    uVar44 = (uVar44 << 0x2f | uVar44 >> 0x11) ^ uVar34;
    uVar23 = uVar23 + uVar13 + uVar42;
    uVar42 = (uVar42 << 0x2c | uVar42 >> 0x14) ^ uVar23;
    uVar32 = ((uVar32 << 5 | uVar32 >> 0x3b) ^ uVar50) + uVar16 + 7;
    uVar50 = uVar43 + uVar11 + uVar15 + uVar32;
    uVar32 = (uVar32 * 0x40000000 | uVar32 >> 0x22) ^ uVar50;
    uVar40 = uVar40 + uVar37;
    uVar39 = (uVar37 << 0x10 | uVar37 >> 0x30) ^ uVar40;
    uVar45 = uVar45 + uVar42;
    uVar42 = (uVar42 << 0x22 | uVar42 >> 0x1e) ^ uVar45;
    uVar35 = uVar35 + uVar44;
    uVar44 = (uVar44 << 0x38 | uVar44 >> 8) ^ uVar35;
    uVar41 = uVar41 + uVar32;
    uVar32 = (uVar32 << 0x33 | uVar32 >> 0xd) ^ uVar41;
    uVar34 = uVar34 + uVar29;
    uVar29 = (uVar29 << 4 | uVar29 >> 0x3c) ^ uVar34;
    uVar23 = uVar23 + uVar31;
    uVar31 = (uVar31 << 0x35 | uVar31 >> 0xb) ^ uVar23;
    uVar50 = uVar50 + uVar36;
    uVar49 = (uVar36 << 0x2a | uVar36 >> 0x16) ^ uVar50;
    uVar30 = uVar30 + uVar47;
    uVar43 = (uVar47 << 0x29 | uVar47 >> 0x17) ^ uVar30;
    uVar40 = uVar40 + uVar29;
    uVar29 = (uVar29 << 0x1f | uVar29 >> 0x21) ^ uVar40;
    uVar35 = uVar35 + uVar43;
    uVar46 = (uVar43 << 0x2e | uVar43 >> 0x12) ^ uVar35;
    uVar23 = uVar23 + uVar32;
    uVar43 = (uVar32 << 0x13 | uVar32 >> 0x2d) ^ uVar23;
    uVar50 = uVar50 + uVar42;
    uVar42 = (uVar42 << 0x2a | uVar42 >> 0x16) ^ uVar50;
    uVar40 = uVar40 + uVar43;
    uVar50 = uVar50 + uVar46;
    uVar32 = ((uVar46 << 0x17 | uVar46 >> 0x29) ^ uVar50) + uVar19;
    uVar47 = uVar40 + uVar20 + uVar32;
    uVar35 = uVar35 + uVar42;
    uVar42 = ((uVar42 << 0x23 | uVar42 >> 0x1d) ^ uVar35) + uVar11 + uVar15;
    uVar45 = uVar45 + uVar49;
    uVar49 = (uVar49 << 0x2c | uVar49 >> 0x14) ^ uVar45;
    uVar41 = uVar41 + uVar31;
    uVar31 = (uVar31 << 0x2f | uVar31 >> 0x11) ^ uVar41;
    uVar30 = uVar30 + uVar44;
    uVar46 = (uVar44 << 0x2c | uVar44 >> 0x14) ^ uVar30;
    uVar34 = uVar34 + uVar39;
    uVar48 = (uVar39 << 0x19 | uVar39 >> 0x27) ^ uVar34;
    uVar45 = uVar45 + uVar46;
    uVar41 = uVar41 + uVar48;
    uVar30 = uVar30 + uVar49;
    uVar34 = uVar34 + uVar31;
    uVar23 = uVar23 + uVar29;
    uVar37 = (uVar32 * 0x1000000 | uVar32 >> 0x28) ^ uVar47;
    uVar31 = ((uVar31 << 0x25 | uVar31 >> 0x1b) ^ uVar34) + uVar21;
    uVar36 = uVar45 + uVar22 + uVar31;
    uVar32 = (uVar31 * 0x2000 | uVar31 >> 0x33) ^ uVar36;
    uVar31 = ((uVar49 << 0x1f | uVar49 >> 0x21) ^ uVar30) + uVar4;
    uVar49 = uVar41 + uVar6 + uVar31;
    uVar39 = (uVar31 * 0x100 | uVar31 >> 0x38) ^ uVar49;
    uVar29 = ((uVar29 << 0x14 | uVar29 >> 0x2c) ^ uVar23) + uVar7;
    uVar44 = uVar35 + uVar8 + uVar29;
    uVar31 = (uVar29 << 0x2f | uVar29 >> 0x11) ^ uVar44;
    uVar29 = ((uVar48 << 0x34 | uVar48 >> 0xc) ^ uVar41) + uVar3;
    uVar30 = uVar30 + uVar10 + uVar29;
    uVar35 = (uVar29 * 0x100 | uVar29 >> 0x38) ^ uVar30;
    uVar29 = ((uVar46 << 0x30 | uVar46 >> 0x10) ^ uVar45) + uVar13;
    uVar46 = uVar34 + uVar12 + uVar29;
    uVar23 = uVar23 + uVar14 + uVar42;
    uVar45 = (uVar29 * 0x20000 | uVar29 >> 0x2f) ^ uVar46;
    uVar29 = (uVar42 * 0x400000 | uVar42 >> 0x2a) ^ uVar23;
    uVar42 = uVar18 + ((uVar43 << 9 | uVar43 >> 0x37) ^ uVar40) + 8;
    uVar50 = uVar50 + uVar5 + uVar16 + uVar42;
    uVar42 = (uVar42 << 0x25 | uVar42 >> 0x1b) ^ uVar50;
    uVar47 = uVar47 + uVar35;
    uVar41 = (uVar35 << 0x26 | uVar35 >> 0x1a) ^ uVar47;
    uVar36 = uVar36 + uVar29;
    uVar29 = (uVar29 << 0x13 | uVar29 >> 0x2d) ^ uVar36;
    uVar44 = uVar44 + uVar45;
    uVar45 = (uVar45 << 10 | uVar45 >> 0x36) ^ uVar44;
    uVar49 = uVar49 + uVar42;
    uVar42 = (uVar42 << 0x37 | uVar42 >> 9) ^ uVar49;
    uVar46 = uVar46 + uVar31;
    uVar31 = (uVar31 << 0x31 | uVar31 >> 0xf) ^ uVar46;
    uVar23 = uVar23 + uVar32;
    uVar32 = (uVar32 << 0x12 | uVar32 >> 0x2e) ^ uVar23;
    uVar50 = uVar50 + uVar39;
    uVar35 = (uVar39 << 0x17 | uVar39 >> 0x29) ^ uVar50;
    uVar30 = uVar30 + uVar37;
    uVar43 = (uVar37 << 0x34 | uVar37 >> 0xc) ^ uVar30;
    uVar47 = uVar47 + uVar31;
    uVar31 = (uVar31 << 0x21 | uVar31 >> 0x1f) ^ uVar47;
    uVar44 = uVar44 + uVar43;
    uVar43 = (uVar43 << 0xd | uVar43 >> 0x33) ^ uVar44;
    uVar23 = uVar23 + uVar42;
    uVar42 = (uVar42 << 0x22 | uVar42 >> 0x1e) ^ uVar23;
    uVar50 = uVar50 + uVar29;
    uVar29 = (uVar29 << 0x29 | uVar29 >> 0x17) ^ uVar50;
    uVar47 = uVar47 + uVar42;
    uVar50 = uVar50 + uVar43;
    uVar40 = ((uVar43 << 0x2f | uVar43 >> 0x11) ^ uVar50) + uVar22;
    uVar34 = uVar47 + uVar19 + uVar40;
    uVar44 = uVar44 + uVar29;
    uVar43 = ((uVar29 << 0x30 | uVar29 >> 0x10) ^ uVar44) + uVar5 + uVar16;
    uVar36 = uVar36 + uVar35;
    uVar37 = (uVar35 << 4 | uVar35 >> 0x3c) ^ uVar36;
    uVar49 = uVar49 + uVar32;
    uVar29 = (uVar32 << 0x33 | uVar32 >> 0xd) ^ uVar49;
    uVar30 = uVar30 + uVar45;
    uVar35 = (uVar45 << 0x3b | uVar45 >> 5) ^ uVar30;
    uVar46 = uVar46 + uVar41;
    uVar41 = (uVar41 << 0x11 | uVar41 >> 0x2f) ^ uVar46;
    uVar36 = uVar36 + uVar35;
    uVar49 = uVar49 + uVar41;
    uVar30 = uVar30 + uVar37;
    uVar46 = uVar46 + uVar29;
    uVar23 = uVar23 + uVar31;
    uVar29 = ((uVar29 << 0x10 | uVar29 >> 0x30) ^ uVar46) + uVar6;
    uVar39 = uVar36 + uVar21 + uVar29;
    uVar40 = (uVar40 << 0x29 | uVar40 >> 0x17) ^ uVar34;
    uVar45 = (uVar29 * 0x200 | uVar29 >> 0x37) ^ uVar39;
    uVar37 = ((uVar37 << 0x1c | uVar37 >> 0x24) ^ uVar30) + uVar8;
    uVar29 = uVar49 + uVar4 + uVar37;
    uVar31 = ((uVar31 << 0x19 | uVar31 >> 0x27) ^ uVar23) + uVar10;
    uVar32 = uVar44 + uVar7 + uVar31;
    uVar37 = (uVar37 << 0x25 | uVar37 >> 0x1b) ^ uVar29;
    uVar44 = (uVar31 * 0x80000000 | uVar31 >> 0x21) ^ uVar32;
    uVar41 = ((uVar41 << 0x29 | uVar41 >> 0x17) ^ uVar49) + uVar12;
    uVar31 = uVar30 + uVar3 + uVar41;
    uVar49 = ((uVar35 << 0x14 | uVar35 >> 0x2c) ^ uVar36) + uVar14;
    uVar35 = uVar46 + uVar13 + uVar49;
    uVar46 = (uVar41 * 0x1000 | uVar41 >> 0x34) ^ uVar31;
    uVar30 = (uVar49 << 0x2f | uVar49 >> 0x11) ^ uVar35;
    uVar23 = uVar23 + uVar15 + uVar43;
    uVar49 = uVar17 + ((uVar42 << 5 | uVar42 >> 0x3b) ^ uVar47) + 9;
    uVar50 = uVar50 + uVar18 + uVar9 + uVar49;
    uVar42 = (uVar43 << 0x2c | uVar43 >> 0x14) ^ uVar23;
    uVar34 = uVar34 + uVar46;
    uVar43 = (uVar49 * 0x40000000 | uVar49 >> 0x22) ^ uVar50;
    uVar39 = uVar39 + uVar42;
    uVar47 = (uVar46 << 0x10 | uVar46 >> 0x30) ^ uVar34;
    uVar32 = uVar32 + uVar30;
    uVar42 = (uVar42 << 0x22 | uVar42 >> 0x1e) ^ uVar39;
    uVar29 = uVar29 + uVar43;
    uVar30 = (uVar30 << 0x38 | uVar30 >> 8) ^ uVar32;
    uVar35 = uVar35 + uVar44;
    uVar49 = (uVar43 << 0x33 | uVar43 >> 0xd) ^ uVar29;
    uVar23 = uVar23 + uVar45;
    uVar43 = (uVar44 << 4 | uVar44 >> 0x3c) ^ uVar35;
    uVar50 = uVar50 + uVar37;
    uVar44 = (uVar45 << 0x35 | uVar45 >> 0xb) ^ uVar23;
    uVar31 = uVar31 + uVar40;
    uVar46 = (uVar37 << 0x2a | uVar37 >> 0x16) ^ uVar50;
    uVar34 = uVar34 + uVar43;
    uVar45 = (uVar40 << 0x29 | uVar40 >> 0x17) ^ uVar31;
    uVar32 = uVar32 + uVar45;
    uVar43 = (uVar43 << 0x1f | uVar43 >> 0x21) ^ uVar34;
    uVar23 = uVar23 + uVar49;
    uVar36 = (uVar45 << 0x2e | uVar45 >> 0x12) ^ uVar32;
    uVar50 = uVar50 + uVar42;
    uVar45 = (uVar49 << 0x13 | uVar49 >> 0x2d) ^ uVar23;
    uVar34 = uVar34 + uVar45;
    uVar42 = (uVar42 << 0x2a | uVar42 >> 0x16) ^ uVar50;
    uVar32 = uVar32 + uVar42;
    uVar50 = uVar50 + uVar36;
    uVar37 = ((uVar36 << 0x17 | uVar36 >> 0x29) ^ uVar50) + uVar21;
    uVar36 = uVar34 + uVar22 + uVar37;
    uVar42 = ((uVar42 << 0x23 | uVar42 >> 0x1d) ^ uVar32) + uVar18 + uVar9;
    uVar39 = uVar39 + uVar46;
    uVar46 = (uVar46 << 0x2c | uVar46 >> 0x14) ^ uVar39;
    uVar29 = uVar29 + uVar44;
    uVar44 = (uVar44 << 0x2f | uVar44 >> 0x11) ^ uVar29;
    uVar31 = uVar31 + uVar30;
    uVar49 = (uVar30 << 0x2c | uVar30 >> 0x14) ^ uVar31;
    uVar35 = uVar35 + uVar47;
    uVar48 = (uVar47 << 0x19 | uVar47 >> 0x27) ^ uVar35;
    uVar39 = uVar39 + uVar49;
    uVar29 = uVar29 + uVar48;
    uVar31 = uVar31 + uVar46;
    uVar35 = uVar35 + uVar44;
    uVar23 = uVar23 + uVar43;
    uVar41 = (uVar37 * 0x1000000 | uVar37 >> 0x28) ^ uVar36;
    uVar44 = ((uVar44 << 0x25 | uVar44 >> 0x1b) ^ uVar35) + uVar4;
    uVar37 = uVar39 + uVar6 + uVar44;
    uVar30 = ((uVar46 << 0x1f | uVar46 >> 0x21) ^ uVar31) + uVar7;
    uVar47 = uVar29 + uVar8 + uVar30;
    uVar44 = (uVar44 * 0x2000 | uVar44 >> 0x33) ^ uVar37;
    uVar40 = (uVar30 * 0x100 | uVar30 >> 0x38) ^ uVar47;
    uVar43 = ((uVar43 << 0x14 | uVar43 >> 0x2c) ^ uVar23) + uVar3;
    uVar30 = uVar32 + uVar10 + uVar43;
    uVar32 = ((uVar48 << 0x34 | uVar48 >> 0xc) ^ uVar29) + uVar13;
    uVar46 = uVar31 + uVar12 + uVar32;
    uVar29 = (uVar43 << 0x2f | uVar43 >> 0x11) ^ uVar30;
    uVar43 = (uVar32 * 0x100 | uVar32 >> 0x38) ^ uVar46;
    uVar31 = ((uVar49 << 0x30 | uVar49 >> 0x10) ^ uVar39) + uVar15;
    uVar49 = uVar35 + uVar14 + uVar31;
    uVar32 = (uVar31 * 0x20000 | uVar31 >> 0x2f) ^ uVar49;
    uVar23 = uVar23 + uVar16 + uVar42;
    uVar42 = (uVar42 * 0x400000 | uVar42 >> 0x2a) ^ uVar23;
    uVar31 = ((uVar45 << 9 | uVar45 >> 0x37) ^ uVar34) + uVar20 + 10;
    uVar45 = uVar50 + uVar11 + uVar17 + uVar31;
    uVar31 = (uVar31 << 0x25 | uVar31 >> 0x1b) ^ uVar45;
    uVar36 = uVar36 + uVar43;
    uVar35 = (uVar43 << 0x26 | uVar43 >> 0x1a) ^ uVar36;
    uVar37 = uVar37 + uVar42;
    uVar42 = (uVar42 << 0x13 | uVar42 >> 0x2d) ^ uVar37;
    uVar30 = uVar30 + uVar32;
    uVar50 = (uVar32 << 10 | uVar32 >> 0x36) ^ uVar30;
    uVar47 = uVar47 + uVar31;
    uVar32 = (uVar31 << 0x37 | uVar31 >> 9) ^ uVar47;
    uVar49 = uVar49 + uVar29;
    uVar29 = (uVar29 << 0x31 | uVar29 >> 0xf) ^ uVar49;
    uVar23 = uVar23 + uVar44;
    uVar31 = (uVar44 << 0x12 | uVar44 >> 0x2e) ^ uVar23;
    uVar45 = uVar45 + uVar40;
    uVar44 = (uVar40 << 0x17 | uVar40 >> 0x29) ^ uVar45;
    uVar46 = uVar46 + uVar41;
    uVar43 = (uVar41 << 0x34 | uVar41 >> 0xc) ^ uVar46;
    uVar36 = uVar36 + uVar29;
    uVar29 = (uVar29 << 0x21 | uVar29 >> 0x1f) ^ uVar36;
    uVar30 = uVar30 + uVar43;
    uVar34 = (uVar43 << 0xd | uVar43 >> 0x33) ^ uVar30;
    uVar23 = uVar23 + uVar32;
    uVar43 = (uVar32 << 0x22 | uVar32 >> 0x1e) ^ uVar23;
    uVar45 = uVar45 + uVar42;
    uVar42 = (uVar42 << 0x29 | uVar42 >> 0x17) ^ uVar45;
    uVar36 = uVar36 + uVar43;
    uVar45 = uVar45 + uVar34;
    uVar34 = ((uVar34 << 0x2f | uVar34 >> 0x11) ^ uVar45) + uVar6;
    uVar40 = uVar36 + uVar21 + uVar34;
    uVar30 = uVar30 + uVar42;
    uVar42 = ((uVar42 << 0x30 | uVar42 >> 0x10) ^ uVar30) + uVar11 + uVar17;
    uVar37 = uVar37 + uVar44;
    uVar44 = (uVar44 << 4 | uVar44 >> 0x3c) ^ uVar37;
    uVar47 = uVar47 + uVar31;
    uVar31 = (uVar31 << 0x33 | uVar31 >> 0xd) ^ uVar47;
    uVar46 = uVar46 + uVar50;
    uVar32 = (uVar50 << 0x3b | uVar50 >> 5) ^ uVar46;
    uVar49 = uVar49 + uVar35;
    uVar48 = (uVar35 << 0x11 | uVar35 >> 0x2f) ^ uVar49;
    uVar37 = uVar37 + uVar32;
    uVar47 = uVar47 + uVar48;
    uVar46 = uVar46 + uVar44;
    uVar49 = uVar49 + uVar31;
    uVar23 = uVar23 + uVar29;
    uVar41 = (uVar34 << 0x29 | uVar34 >> 0x17) ^ uVar40;
    uVar31 = ((uVar31 << 0x10 | uVar31 >> 0x30) ^ uVar49) + uVar8;
    uVar35 = uVar37 + uVar4 + uVar31;
    uVar31 = (uVar31 * 0x200 | uVar31 >> 0x37) ^ uVar35;
    uVar44 = ((uVar44 << 0x1c | uVar44 >> 0x24) ^ uVar46) + uVar10;
    uVar34 = uVar47 + uVar7 + uVar44;
    uVar39 = (uVar44 << 0x25 | uVar44 >> 0x1b) ^ uVar34;
    uVar29 = ((uVar29 << 0x19 | uVar29 >> 0x27) ^ uVar23) + uVar12;
    uVar50 = uVar30 + uVar3 + uVar29;
    uVar29 = (uVar29 * 0x80000000 | uVar29 >> 0x21) ^ uVar50;
    uVar30 = ((uVar48 << 0x29 | uVar48 >> 0x17) ^ uVar47) + uVar14;
    uVar44 = uVar46 + uVar13 + uVar30;
    uVar46 = (uVar30 * 0x1000 | uVar30 >> 0x34) ^ uVar44;
    uVar30 = ((uVar32 << 0x14 | uVar32 >> 0x2c) ^ uVar37) + uVar16;
    uVar49 = uVar49 + uVar15 + uVar30;
    uVar32 = uVar23 + uVar18 + uVar42;
    uVar30 = (uVar30 << 0x2f | uVar30 >> 0x11) ^ uVar49;
    uVar23 = (uVar42 << 0x2c | uVar42 >> 0x14) ^ uVar32;
    uVar42 = ((uVar43 << 5 | uVar43 >> 0x3b) ^ uVar36) + uVar19 + 0xb;
    uVar47 = uVar45 + uVar5 + uVar20 + uVar42;
    uVar43 = (uVar42 * 0x40000000 | uVar42 >> 0x22) ^ uVar47;
    uVar40 = uVar40 + uVar46;
    uVar46 = (uVar46 << 0x10 | uVar46 >> 0x30) ^ uVar40;
    uVar35 = uVar35 + uVar23;
    uVar42 = (uVar23 << 0x22 | uVar23 >> 0x1e) ^ uVar35;
    uVar50 = uVar50 + uVar30;
    uVar45 = (uVar30 << 0x38 | uVar30 >> 8) ^ uVar50;
    uVar34 = uVar34 + uVar43;
    uVar43 = (uVar43 << 0x33 | uVar43 >> 0xd) ^ uVar34;
    uVar49 = uVar49 + uVar29;
    uVar29 = (uVar29 << 4 | uVar29 >> 0x3c) ^ uVar49;
    uVar32 = uVar32 + uVar31;
    uVar23 = (uVar31 << 0x35 | uVar31 >> 0xb) ^ uVar32;
    uVar47 = uVar47 + uVar39;
    uVar31 = (uVar39 << 0x2a | uVar39 >> 0x16) ^ uVar47;
    uVar44 = uVar44 + uVar41;
    uVar30 = (uVar41 << 0x29 | uVar41 >> 0x17) ^ uVar44;
    uVar40 = uVar40 + uVar29;
    uVar29 = (uVar29 << 0x1f | uVar29 >> 0x21) ^ uVar40;
    uVar50 = uVar50 + uVar30;
    uVar30 = (uVar30 << 0x2e | uVar30 >> 0x12) ^ uVar50;
    uVar32 = uVar32 + uVar43;
    uVar43 = (uVar43 << 0x13 | uVar43 >> 0x2d) ^ uVar32;
    uVar47 = uVar47 + uVar42;
    uVar42 = (uVar42 << 0x2a | uVar42 >> 0x16) ^ uVar47;
    uVar40 = uVar40 + uVar43;
    uVar47 = uVar47 + uVar30;
    uVar36 = ((uVar30 << 0x17 | uVar30 >> 0x29) ^ uVar47) + uVar4;
    uVar37 = uVar40 + uVar6 + uVar36;
    uVar50 = uVar50 + uVar42;
    uVar42 = ((uVar42 << 0x23 | uVar42 >> 0x1d) ^ uVar50) + uVar5 + uVar20;
    uVar35 = uVar35 + uVar31;
    uVar30 = (uVar31 << 0x2c | uVar31 >> 0x14) ^ uVar35;
    uVar34 = uVar34 + uVar23;
    uVar23 = (uVar23 << 0x2f | uVar23 >> 0x11) ^ uVar34;
    uVar44 = uVar44 + uVar45;
    uVar31 = (uVar45 << 0x2c | uVar45 >> 0x14) ^ uVar44;
    uVar49 = uVar49 + uVar46;
    uVar41 = (uVar46 << 0x19 | uVar46 >> 0x27) ^ uVar49;
    uVar35 = uVar35 + uVar31;
    uVar34 = uVar34 + uVar41;
    uVar44 = uVar44 + uVar30;
    uVar49 = uVar49 + uVar23;
    uVar32 = uVar32 + uVar29;
    uVar23 = ((uVar23 << 0x25 | uVar23 >> 0x1b) ^ uVar49) + uVar7;
    uVar46 = uVar35 + uVar8 + uVar23;
    uVar39 = (uVar36 * 0x1000000 | uVar36 >> 0x28) ^ uVar37;
    uVar23 = (uVar23 * 0x2000 | uVar23 >> 0x33) ^ uVar46;
    uVar30 = ((uVar30 << 0x1f | uVar30 >> 0x21) ^ uVar44) + uVar3;
    uVar45 = uVar34 + uVar10 + uVar30;
    uVar29 = ((uVar29 << 0x14 | uVar29 >> 0x2c) ^ uVar32) + uVar13;
    uVar50 = uVar50 + uVar12 + uVar29;
    uVar36 = (uVar30 * 0x100 | uVar30 >> 0x38) ^ uVar45;
    uVar29 = (uVar29 << 0x2f | uVar29 >> 0x11) ^ uVar50;
    uVar41 = ((uVar41 << 0x34 | uVar41 >> 0xc) ^ uVar34) + uVar15;
    uVar30 = uVar44 + uVar14 + uVar41;
    uVar31 = ((uVar31 << 0x30 | uVar31 >> 0x10) ^ uVar35) + uVar18;
    uVar34 = uVar49 + uVar16 + uVar31;
    uVar35 = (uVar41 * 0x100 | uVar41 >> 0x38) ^ uVar30;
    uVar49 = (uVar31 * 0x20000 | uVar31 >> 0x2f) ^ uVar34;
    uVar31 = uVar32 + uVar17 + uVar42;
    uVar32 = ((uVar43 << 9 | uVar43 >> 0x37) ^ uVar40) + uVar22 + 0xc;
    uVar44 = uVar47 + uVar19 + uVar9 + uVar32;
    uVar42 = (uVar42 * 0x400000 | uVar42 >> 0x2a) ^ uVar31;
    uVar37 = uVar37 + uVar35;
    uVar32 = (uVar32 << 0x25 | uVar32 >> 0x1b) ^ uVar44;
    uVar46 = uVar46 + uVar42;
    uVar47 = (uVar35 << 0x26 | uVar35 >> 0x1a) ^ uVar37;
    uVar50 = uVar50 + uVar49;
    uVar42 = (uVar42 << 0x13 | uVar42 >> 0x2d) ^ uVar46;
    uVar45 = uVar45 + uVar32;
    uVar49 = (uVar49 << 10 | uVar49 >> 0x36) ^ uVar50;
    uVar34 = uVar34 + uVar29;
    uVar32 = (uVar32 << 0x37 | uVar32 >> 9) ^ uVar45;
    uVar31 = uVar31 + uVar23;
    uVar29 = (uVar29 << 0x31 | uVar29 >> 0xf) ^ uVar34;
    uVar44 = uVar44 + uVar36;
    uVar23 = (uVar23 << 0x12 | uVar23 >> 0x2e) ^ uVar31;
    uVar30 = uVar30 + uVar39;
    uVar35 = (uVar36 << 0x17 | uVar36 >> 0x29) ^ uVar44;
    uVar37 = uVar37 + uVar29;
    uVar43 = (uVar39 << 0x34 | uVar39 >> 0xc) ^ uVar30;
    uVar50 = uVar50 + uVar43;
    uVar29 = (uVar29 << 0x21 | uVar29 >> 0x1f) ^ uVar37;
    uVar31 = uVar31 + uVar32;
    uVar36 = (uVar43 << 0xd | uVar43 >> 0x33) ^ uVar50;
    uVar44 = uVar44 + uVar42;
    uVar43 = (uVar32 << 0x22 | uVar32 >> 0x1e) ^ uVar31;
    uVar37 = uVar37 + uVar43;
    uVar42 = (uVar42 << 0x29 | uVar42 >> 0x17) ^ uVar44;
    uVar50 = uVar50 + uVar42;
    uVar44 = uVar44 + uVar36;
    uVar40 = ((uVar36 << 0x2f | uVar36 >> 0x11) ^ uVar44) + uVar8;
    uVar32 = uVar37 + uVar4 + uVar40;
    uVar42 = ((uVar42 << 0x30 | uVar42 >> 0x10) ^ uVar50) + uVar19 + uVar9;
    uVar46 = uVar46 + uVar35;
    uVar39 = (uVar35 << 4 | uVar35 >> 0x3c) ^ uVar46;
    uVar45 = uVar45 + uVar23;
    uVar23 = (uVar23 << 0x33 | uVar23 >> 0xd) ^ uVar45;
    uVar30 = uVar30 + uVar49;
    uVar36 = (uVar49 << 0x3b | uVar49 >> 5) ^ uVar30;
    uVar34 = uVar34 + uVar47;
    uVar41 = (uVar47 << 0x11 | uVar47 >> 0x2f) ^ uVar34;
    uVar46 = uVar46 + uVar36;
    uVar45 = uVar45 + uVar41;
    uVar30 = uVar30 + uVar39;
    uVar34 = uVar34 + uVar23;
    uVar31 = uVar31 + uVar29;
    uVar40 = (uVar40 << 0x29 | uVar40 >> 0x17) ^ uVar32;
    uVar23 = ((uVar23 << 0x10 | uVar23 >> 0x30) ^ uVar34) + uVar10;
    uVar35 = uVar46 + uVar7 + uVar23;
    uVar39 = ((uVar39 << 0x1c | uVar39 >> 0x24) ^ uVar30) + uVar12;
    uVar49 = uVar45 + uVar3 + uVar39;
    uVar23 = (uVar23 * 0x200 | uVar23 >> 0x37) ^ uVar35;
    uVar39 = (uVar39 << 0x25 | uVar39 >> 0x1b) ^ uVar49;
    uVar29 = ((uVar29 << 0x19 | uVar29 >> 0x27) ^ uVar31) + uVar14;
    uVar47 = uVar50 + uVar13 + uVar29;
    uVar45 = ((uVar41 << 0x29 | uVar41 >> 0x17) ^ uVar45) + uVar16;
    uVar30 = uVar30 + uVar15 + uVar45;
    uVar29 = (uVar29 * 0x80000000 | uVar29 >> 0x21) ^ uVar47;
    uVar41 = (uVar45 * 0x1000 | uVar45 >> 0x34) ^ uVar30;
    uVar50 = ((uVar36 << 0x14 | uVar36 >> 0x2c) ^ uVar46) + uVar17;
    uVar45 = uVar34 + uVar18 + uVar50;
    uVar34 = (uVar50 << 0x2f | uVar50 >> 0x11) ^ uVar45;
    uVar50 = uVar31 + uVar20 + uVar42;
    uVar42 = (uVar42 << 0x2c | uVar42 >> 0x14) ^ uVar50;
    uVar31 = ((uVar43 << 5 | uVar43 >> 0x3b) ^ uVar37) + uVar21 + 0xd;
    uVar37 = uVar44 + uVar11 + uVar22 + uVar31;
    uVar31 = (uVar31 * 0x40000000 | uVar31 >> 0x22) ^ uVar37;
    uVar32 = uVar32 + uVar41;
    uVar41 = (uVar41 << 0x10 | uVar41 >> 0x30) ^ uVar32;
    uVar35 = uVar35 + uVar42;
    uVar42 = (uVar42 << 0x22 | uVar42 >> 0x1e) ^ uVar35;
    uVar47 = uVar47 + uVar34;
    uVar44 = (uVar34 << 0x38 | uVar34 >> 8) ^ uVar47;
    uVar49 = uVar49 + uVar31;
    uVar31 = (uVar31 << 0x33 | uVar31 >> 0xd) ^ uVar49;
    uVar45 = uVar45 + uVar29;
    uVar29 = (uVar29 << 4 | uVar29 >> 0x3c) ^ uVar45;
    uVar50 = uVar50 + uVar23;
    uVar23 = (uVar23 << 0x35 | uVar23 >> 0xb) ^ uVar50;
    uVar37 = uVar37 + uVar39;
    uVar34 = (uVar39 << 0x2a | uVar39 >> 0x16) ^ uVar37;
    uVar30 = uVar30 + uVar40;
    uVar43 = (uVar40 << 0x29 | uVar40 >> 0x17) ^ uVar30;
    uVar32 = uVar32 + uVar29;
    uVar29 = (uVar29 << 0x1f | uVar29 >> 0x21) ^ uVar32;
    uVar47 = uVar47 + uVar43;
    uVar43 = (uVar43 << 0x2e | uVar43 >> 0x12) ^ uVar47;
    uVar50 = uVar50 + uVar31;
    uVar31 = (uVar31 << 0x13 | uVar31 >> 0x2d) ^ uVar50;
    uVar37 = uVar37 + uVar42;
    uVar42 = (uVar42 << 0x2a | uVar42 >> 0x16) ^ uVar37;
    uVar32 = uVar32 + uVar31;
    uVar37 = uVar37 + uVar43;
    uVar46 = ((uVar43 << 0x17 | uVar43 >> 0x29) ^ uVar37) + uVar7;
    uVar43 = uVar32 + uVar8 + uVar46;
    uVar47 = uVar47 + uVar42;
    uVar42 = ((uVar42 << 0x23 | uVar42 >> 0x1d) ^ uVar47) + uVar11 + uVar22;
    uVar35 = uVar35 + uVar34;
    uVar36 = (uVar34 << 0x2c | uVar34 >> 0x14) ^ uVar35;
    uVar49 = uVar49 + uVar23;
    uVar23 = (uVar23 << 0x2f | uVar23 >> 0x11) ^ uVar49;
    uVar30 = uVar30 + uVar44;
    uVar34 = (uVar44 << 0x2c | uVar44 >> 0x14) ^ uVar30;
    uVar45 = uVar45 + uVar41;
    uVar41 = (uVar41 << 0x19 | uVar41 >> 0x27) ^ uVar45;
    uVar35 = uVar35 + uVar34;
    uVar49 = uVar49 + uVar41;
    uVar30 = uVar30 + uVar36;
    uVar45 = uVar45 + uVar23;
    uVar50 = uVar50 + uVar29;
    uVar39 = (uVar46 * 0x1000000 | uVar46 >> 0x28) ^ uVar43;
    uVar23 = ((uVar23 << 0x25 | uVar23 >> 0x1b) ^ uVar45) + uVar3;
    uVar46 = uVar35 + uVar10 + uVar23;
    uVar23 = (uVar23 * 0x2000 | uVar23 >> 0x33) ^ uVar46;
    uVar44 = ((uVar36 << 0x1f | uVar36 >> 0x21) ^ uVar30) + uVar13;
    uVar40 = uVar49 + uVar12 + uVar44;
    uVar36 = (uVar44 * 0x100 | uVar44 >> 0x38) ^ uVar40;
    uVar29 = ((uVar29 << 0x14 | uVar29 >> 0x2c) ^ uVar50) + uVar15;
    uVar44 = uVar47 + uVar14 + uVar29;
    uVar29 = (uVar29 << 0x2f | uVar29 >> 0x11) ^ uVar44;
    uVar49 = ((uVar41 << 0x34 | uVar41 >> 0xc) ^ uVar49) + uVar18;
    uVar41 = uVar30 + uVar16 + uVar49;
    uVar47 = (uVar49 * 0x100 | uVar49 >> 0x38) ^ uVar41;
    uVar34 = ((uVar34 << 0x30 | uVar34 >> 0x10) ^ uVar35) + uVar20;
    uVar49 = uVar45 + uVar17 + uVar34;
    uVar50 = uVar50 + uVar19 + uVar42;
    uVar45 = (uVar34 * 0x20000 | uVar34 >> 0x2f) ^ uVar49;
    uVar42 = (uVar42 * 0x400000 | uVar42 >> 0x2a) ^ uVar50;
    uVar31 = ((uVar31 << 9 | uVar31 >> 0x37) ^ uVar32) + uVar6 + 0xe;
    uVar30 = uVar37 + uVar5 + uVar21 + uVar31;
    uVar31 = (uVar31 << 0x25 | uVar31 >> 0x1b) ^ uVar30;
    uVar43 = uVar43 + uVar47;
    uVar37 = (uVar47 << 0x26 | uVar47 >> 0x1a) ^ uVar43;
    uVar46 = uVar46 + uVar42;
    uVar42 = (uVar42 << 0x13 | uVar42 >> 0x2d) ^ uVar46;
    uVar44 = uVar44 + uVar45;
    uVar34 = (uVar45 << 10 | uVar45 >> 0x36) ^ uVar44;
    uVar40 = uVar40 + uVar31;
    uVar32 = (uVar31 << 0x37 | uVar31 >> 9) ^ uVar40;
    uVar49 = uVar49 + uVar29;
    uVar29 = (uVar29 << 0x31 | uVar29 >> 0xf) ^ uVar49;
    uVar50 = uVar50 + uVar23;
    uVar23 = (uVar23 << 0x12 | uVar23 >> 0x2e) ^ uVar50;
    uVar30 = uVar30 + uVar36;
    uVar35 = (uVar36 << 0x17 | uVar36 >> 0x29) ^ uVar30;
    uVar41 = uVar41 + uVar39;
    uVar45 = (uVar39 << 0x34 | uVar39 >> 0xc) ^ uVar41;
    uVar43 = uVar43 + uVar29;
    uVar31 = (uVar29 << 0x21 | uVar29 >> 0x1f) ^ uVar43;
    uVar44 = uVar44 + uVar45;
    uVar29 = (uVar45 << 0xd | uVar45 >> 0x33) ^ uVar44;
    uVar50 = uVar50 + uVar32;
    uVar32 = (uVar32 << 0x22 | uVar32 >> 0x1e) ^ uVar50;
    uVar30 = uVar30 + uVar42;
    uVar42 = (uVar42 << 0x29 | uVar42 >> 0x17) ^ uVar30;
    uVar43 = uVar43 + uVar32;
    uVar30 = uVar30 + uVar29;
    uVar39 = ((uVar29 << 0x2f | uVar29 >> 0x11) ^ uVar30) + uVar10;
    uVar45 = uVar43 + uVar39 + uVar7;
    uVar44 = uVar44 + uVar42;
    uVar42 = ((uVar42 << 0x30 | uVar42 >> 0x10) ^ uVar44) + uVar5 + uVar21;
    uVar46 = uVar46 + uVar35;
    uVar35 = (uVar35 << 4 | uVar35 >> 0x3c) ^ uVar46;
    uVar40 = uVar40 + uVar23;
    uVar23 = (uVar23 << 0x33 | uVar23 >> 0xd) ^ uVar40;
    uVar41 = uVar41 + uVar34;
    uVar36 = (uVar34 << 0x3b | uVar34 >> 5) ^ uVar41;
    uVar49 = uVar49 + uVar37;
    uVar37 = (uVar37 << 0x11 | uVar37 >> 0x2f) ^ uVar49;
    uVar46 = uVar46 + uVar36;
    uVar40 = uVar40 + uVar37;
    uVar41 = uVar41 + uVar35;
    uVar49 = uVar49 + uVar23;
    uVar50 = uVar50 + uVar31;
    uVar23 = ((uVar23 << 0x10 | uVar23 >> 0x30) ^ uVar49) + uVar12;
    uVar29 = uVar46 + uVar3 + uVar23;
    uVar47 = (uVar39 << 0x29 | uVar39 >> 0x17) ^ uVar45;
    uVar23 = (uVar23 * 0x200 | uVar23 >> 0x37) ^ uVar29;
    uVar39 = ((uVar35 << 0x1c | uVar35 >> 0x24) ^ uVar41) + uVar14;
    uVar34 = uVar40 + uVar13 + uVar39;
    uVar31 = ((uVar31 << 0x19 | uVar31 >> 0x27) ^ uVar50) + uVar16;
    uVar35 = uVar44 + uVar15 + uVar31;
    uVar39 = (uVar39 << 0x25 | uVar39 >> 0x1b) ^ uVar34;
    uVar31 = (uVar31 * 0x80000000 | uVar31 >> 0x21) ^ uVar35;
    uVar40 = ((uVar37 << 0x29 | uVar37 >> 0x17) ^ uVar40) + uVar17;
    uVar37 = uVar41 + uVar18 + uVar40;
    uVar46 = ((uVar36 << 0x14 | uVar36 >> 0x2c) ^ uVar46) + uVar19;
    uVar44 = uVar49 + uVar20 + uVar46;
    uVar36 = (uVar40 * 0x1000 | uVar40 >> 0x34) ^ uVar37;
    uVar46 = (uVar46 << 0x2f | uVar46 >> 0x11) ^ uVar44;
    uVar49 = uVar50 + uVar22 + uVar42;
    uVar32 = ((uVar32 << 5 | uVar32 >> 0x3b) ^ uVar43) + uVar4 + 0xf;
    uVar41 = uVar30 + uVar9 + uVar6 + uVar32;
    uVar42 = (uVar42 << 0x2c | uVar42 >> 0x14) ^ uVar49;
    uVar45 = uVar45 + uVar36;
    uVar32 = (uVar32 * 0x40000000 | uVar32 >> 0x22) ^ uVar41;
    uVar29 = uVar29 + uVar42;
    uVar40 = (uVar36 << 0x10 | uVar36 >> 0x30) ^ uVar45;
    uVar35 = uVar35 + uVar46;
    uVar42 = (uVar42 << 0x22 | uVar42 >> 0x1e) ^ uVar29;
    uVar34 = uVar34 + uVar32;
    uVar30 = (uVar46 << 0x38 | uVar46 >> 8) ^ uVar35;
    uVar44 = uVar44 + uVar31;
    uVar43 = (uVar32 << 0x33 | uVar32 >> 0xd) ^ uVar34;
    uVar49 = uVar49 + uVar23;
    uVar31 = (uVar31 << 4 | uVar31 >> 0x3c) ^ uVar44;
    uVar41 = uVar41 + uVar39;
    uVar23 = (uVar23 << 0x35 | uVar23 >> 0xb) ^ uVar49;
    uVar37 = uVar37 + uVar47;
    uVar36 = (uVar39 << 0x2a | uVar39 >> 0x16) ^ uVar41;
    uVar45 = uVar45 + uVar31;
    uVar50 = (uVar47 << 0x29 | uVar47 >> 0x17) ^ uVar37;
    uVar35 = uVar35 + uVar50;
    uVar32 = (uVar31 << 0x1f | uVar31 >> 0x21) ^ uVar45;
    uVar49 = uVar49 + uVar43;
    uVar31 = (uVar50 << 0x2e | uVar50 >> 0x12) ^ uVar35;
    uVar41 = uVar41 + uVar42;
    uVar50 = (uVar43 << 0x13 | uVar43 >> 0x2d) ^ uVar49;
    uVar45 = uVar45 + uVar50;
    uVar42 = (uVar42 << 0x2a | uVar42 >> 0x16) ^ uVar41;
    uVar35 = uVar35 + uVar42;
    uVar41 = uVar41 + uVar31;
    uVar31 = ((uVar31 << 0x17 | uVar31 >> 0x29) ^ uVar41) + uVar3;
    uVar46 = uVar45 + uVar10 + uVar31;
    uVar42 = ((uVar42 << 0x23 | uVar42 >> 0x1d) ^ uVar35) + uVar9 + uVar6;
    uVar29 = uVar29 + uVar36;
    uVar36 = (uVar36 << 0x2c | uVar36 >> 0x14) ^ uVar29;
    uVar34 = uVar34 + uVar23;
    uVar23 = (uVar23 << 0x2f | uVar23 >> 0x11) ^ uVar34;
    uVar37 = uVar37 + uVar30;
    uVar43 = (uVar30 << 0x2c | uVar30 >> 0x14) ^ uVar37;
    uVar44 = uVar44 + uVar40;
    uVar40 = (uVar40 << 0x19 | uVar40 >> 0x27) ^ uVar44;
    uVar29 = uVar29 + uVar43;
    uVar34 = uVar34 + uVar40;
    uVar37 = uVar37 + uVar36;
    uVar44 = uVar44 + uVar23;
    uVar49 = uVar49 + uVar32;
    uVar47 = (uVar31 * 0x1000000 | uVar31 >> 0x28) ^ uVar46;
    uVar23 = ((uVar23 << 0x25 | uVar23 >> 0x1b) ^ uVar44) + uVar13;
    uVar31 = uVar29 + uVar12 + uVar23;
    uVar30 = ((uVar36 << 0x1f | uVar36 >> 0x21) ^ uVar37) + uVar15;
    uVar36 = uVar34 + uVar14 + uVar30;
    uVar23 = (uVar23 * 0x2000 | uVar23 >> 0x33) ^ uVar31;
    uVar39 = (uVar30 * 0x100 | uVar30 >> 0x38) ^ uVar36;
    uVar32 = ((uVar32 << 0x14 | uVar32 >> 0x2c) ^ uVar49) + uVar18;
    uVar30 = uVar35 + uVar16 + uVar32;
    uVar34 = ((uVar40 << 0x34 | uVar40 >> 0xc) ^ uVar34) + uVar20;
    uVar48 = uVar37 + uVar17 + uVar34;
    uVar32 = (uVar32 << 0x2f | uVar32 >> 0x11) ^ uVar30;
    uVar35 = (uVar34 * 0x100 | uVar34 >> 0x38) ^ uVar48;
    uVar29 = ((uVar43 << 0x30 | uVar43 >> 0x10) ^ uVar29) + uVar22;
    uVar40 = uVar44 + uVar19 + uVar29;
    uVar34 = (uVar29 * 0x20000 | uVar29 >> 0x2f) ^ uVar40;
    uVar43 = uVar49 + uVar21 + uVar42;
    uVar42 = (uVar42 * 0x400000 | uVar42 >> 0x2a) ^ uVar43;
    uVar29 = uVar8 + ((uVar50 << 9 | uVar50 >> 0x37) ^ uVar45) + 0x10;
    uVar44 = uVar41 + uVar11 + uVar4 + uVar29;
    uVar29 = (uVar29 << 0x25 | uVar29 >> 0x1b) ^ uVar44;
    uVar46 = uVar46 + uVar35;
    uVar37 = (uVar35 << 0x26 | uVar35 >> 0x1a) ^ uVar46;
    uVar31 = uVar31 + uVar42;
    uVar42 = (uVar42 << 0x13 | uVar42 >> 0x2d) ^ uVar31;
    uVar30 = uVar30 + uVar34;
    uVar45 = (uVar34 << 10 | uVar34 >> 0x36) ^ uVar30;
    uVar36 = uVar36 + uVar29;
    uVar29 = (uVar29 << 0x37 | uVar29 >> 9) ^ uVar36;
    uVar40 = uVar40 + uVar32;
    uVar32 = (uVar32 << 0x31 | uVar32 >> 0xf) ^ uVar40;
    uVar43 = uVar43 + uVar23;
    uVar23 = (uVar23 << 0x12 | uVar23 >> 0x2e) ^ uVar43;
    uVar44 = uVar44 + uVar39;
    uVar49 = (uVar39 << 0x17 | uVar39 >> 0x29) ^ uVar44;
    uVar48 = uVar48 + uVar47;
    uVar50 = (uVar47 << 0x34 | uVar47 >> 0xc) ^ uVar48;
    uVar46 = uVar46 + uVar32;
    uVar32 = (uVar32 << 0x21 | uVar32 >> 0x1f) ^ uVar46;
    uVar30 = uVar30 + uVar50;
    uVar50 = (uVar50 << 0xd | uVar50 >> 0x33) ^ uVar30;
    uVar43 = uVar43 + uVar29;
    uVar29 = (uVar29 << 0x22 | uVar29 >> 0x1e) ^ uVar43;
    uVar44 = uVar44 + uVar42;
    uVar42 = (uVar42 << 0x29 | uVar42 >> 0x17) ^ uVar44;
    uVar46 = uVar46 + uVar29;
    uVar44 = uVar44 + uVar50;
    uVar34 = ((uVar50 << 0x2f | uVar50 >> 0x11) ^ uVar44) + uVar12;
    uVar35 = uVar46 + uVar3 + uVar34;
    uVar30 = uVar30 + uVar42;
    uVar42 = ((uVar42 << 0x30 | uVar42 >> 0x10) ^ uVar30) + uVar11 + uVar4;
    uVar31 = uVar31 + uVar49;
    uVar50 = (uVar49 << 4 | uVar49 >> 0x3c) ^ uVar31;
    uVar36 = uVar36 + uVar23;
    uVar23 = (uVar23 << 0x33 | uVar23 >> 0xd) ^ uVar36;
    uVar48 = uVar48 + uVar45;
    uVar45 = (uVar45 << 0x3b | uVar45 >> 5) ^ uVar48;
    uVar40 = uVar40 + uVar37;
    uVar39 = (uVar37 << 0x11 | uVar37 >> 0x2f) ^ uVar40;
    uVar31 = uVar31 + uVar45;
    uVar36 = uVar36 + uVar39;
    uVar48 = uVar48 + uVar50;
    uVar40 = uVar40 + uVar23;
    uVar43 = uVar43 + uVar32;
    uVar41 = (uVar34 << 0x29 | uVar34 >> 0x17) ^ uVar35;
    uVar23 = ((uVar23 << 0x10 | uVar23 >> 0x30) ^ uVar40) + uVar14;
    uVar49 = uVar31 + uVar13 + uVar23;
    uVar23 = (uVar23 * 0x200 | uVar23 >> 0x37) ^ uVar49;
    uVar50 = ((uVar50 << 0x1c | uVar50 >> 0x24) ^ uVar48) + uVar16;
    uVar34 = uVar36 + uVar15 + uVar50;
    uVar37 = (uVar50 << 0x25 | uVar50 >> 0x1b) ^ uVar34;
    uVar32 = ((uVar32 << 0x19 | uVar32 >> 0x27) ^ uVar43) + uVar17;
    uVar50 = uVar30 + uVar18 + uVar32;
    uVar32 = (uVar32 * 0x80000000 | uVar32 >> 0x21) ^ uVar50;
    uVar30 = ((uVar39 << 0x29 | uVar39 >> 0x17) ^ uVar36) + uVar19;
    uVar47 = uVar48 + uVar20 + uVar30;
    uVar30 = (uVar30 * 0x1000 | uVar30 >> 0x34) ^ uVar47;
    uVar31 = ((uVar45 << 0x14 | uVar45 >> 0x2c) ^ uVar31) + uVar21;
    uVar36 = uVar40 + uVar22 + uVar31;
    uVar45 = uVar43 + uVar6 + uVar42;
    uVar31 = (uVar31 << 0x2f | uVar31 >> 0x11) ^ uVar36;
    uVar42 = (uVar42 << 0x2c | uVar42 >> 0x14) ^ uVar45;
    uVar29 = ((uVar29 << 5 | uVar29 >> 0x3b) ^ uVar46) + uVar7 + 0x11;
    uVar39 = uVar44 + uVar5 + uVar8 + uVar29;
    uVar29 = (uVar29 * 0x40000000 | uVar29 >> 0x22) ^ uVar39;
    uVar35 = uVar35 + uVar30;
    uVar40 = (uVar30 << 0x10 | uVar30 >> 0x30) ^ uVar35;
    uVar49 = uVar49 + uVar42;
    uVar42 = (uVar42 << 0x22 | uVar42 >> 0x1e) ^ uVar49;
    uVar50 = uVar50 + uVar31;
    uVar30 = (uVar31 << 0x38 | uVar31 >> 8) ^ uVar50;
    uVar34 = uVar34 + uVar29;
    uVar29 = (uVar29 << 0x33 | uVar29 >> 0xd) ^ uVar34;
    uVar36 = uVar36 + uVar32;
    uVar31 = (uVar32 << 4 | uVar32 >> 0x3c) ^ uVar36;
    uVar45 = uVar45 + uVar23;
    uVar23 = (uVar23 << 0x35 | uVar23 >> 0xb) ^ uVar45;
    uVar39 = uVar39 + uVar37;
    uVar37 = (uVar37 << 0x2a | uVar37 >> 0x16) ^ uVar39;
    uVar47 = uVar47 + uVar41;
    uVar32 = (uVar41 << 0x29 | uVar41 >> 0x17) ^ uVar47;
    uVar35 = uVar35 + uVar31;
    uVar44 = (uVar31 << 0x1f | uVar31 >> 0x21) ^ uVar35;
    uVar50 = uVar50 + uVar32;
    uVar31 = (uVar32 << 0x2e | uVar32 >> 0x12) ^ uVar50;
    uVar45 = uVar45 + uVar29;
    uVar43 = (uVar29 << 0x13 | uVar29 >> 0x2d) ^ uVar45;
    uVar39 = uVar39 + uVar42;
    uVar42 = (uVar42 << 0x2a | uVar42 >> 0x16) ^ uVar39;
    uVar35 = uVar35 + uVar43;
    uVar39 = uVar39 + uVar31;
    uVar29 = ((uVar31 << 0x17 | uVar31 >> 0x29) ^ uVar39) + uVar13;
    uVar46 = uVar35 + uVar12 + uVar29;
    uVar50 = uVar50 + uVar42;
    uVar32 = ((uVar42 << 0x23 | uVar42 >> 0x1d) ^ uVar50) + uVar5 + uVar8;
    uVar49 = uVar49 + uVar37;
    uVar42 = (uVar37 << 0x2c | uVar37 >> 0x14) ^ uVar49;
    uVar34 = uVar34 + uVar23;
    uVar23 = (uVar23 << 0x2f | uVar23 >> 0x11) ^ uVar34;
    uVar47 = uVar47 + uVar30;
    uVar37 = (uVar30 << 0x2c | uVar30 >> 0x14) ^ uVar47;
    uVar36 = uVar36 + uVar40;
    uVar48 = (uVar40 << 0x19 | uVar40 >> 0x27) ^ uVar36;
    uVar49 = uVar49 + uVar37;
    uVar34 = uVar34 + uVar48;
    uVar47 = uVar47 + uVar42;
    uVar36 = uVar36 + uVar23;
    uVar45 = uVar45 + uVar44;
    uVar23 = ((uVar23 << 0x25 | uVar23 >> 0x1b) ^ uVar36) + uVar15;
    uVar31 = uVar49 + uVar14 + uVar23;
    uVar41 = (uVar29 * 0x1000000 | uVar29 >> 0x28) ^ uVar46;
    uVar23 = (uVar23 * 0x2000 | uVar23 >> 0x33) ^ uVar31;
    uVar40 = ((uVar42 << 0x1f | uVar42 >> 0x21) ^ uVar47) + uVar18;
    uVar30 = uVar34 + uVar16 + uVar40;
    uVar29 = ((uVar44 << 0x14 | uVar44 >> 0x2c) ^ uVar45) + uVar20;
    uVar42 = uVar50 + uVar17 + uVar29;
    uVar40 = (uVar40 * 0x100 | uVar40 >> 0x38) ^ uVar30;
    uVar44 = (uVar29 << 0x2f | uVar29 >> 0x11) ^ uVar42;
    uVar50 = ((uVar48 << 0x34 | uVar48 >> 0xc) ^ uVar34) + uVar22;
    uVar47 = uVar47 + uVar19 + uVar50;
    uVar49 = ((uVar37 << 0x30 | uVar37 >> 0x10) ^ uVar49) + uVar6;
    uVar29 = uVar36 + uVar21 + uVar49;
    uVar36 = (uVar50 * 0x100 | uVar50 >> 0x38) ^ uVar47;
    uVar50 = (uVar49 * 0x20000 | uVar49 >> 0x2f) ^ uVar29;
    uVar49 = uVar45 + uVar4 + uVar32;
    uVar43 = ((uVar43 << 9 | uVar43 >> 0x37) ^ uVar35) + uVar10 + 0x12;
    uVar34 = uVar39 + uVar9 + uVar7 + uVar43;
    uVar32 = (uVar32 * 0x400000 | uVar32 >> 0x2a) ^ uVar49;
    uVar46 = uVar46 + uVar36;
    uVar43 = (uVar43 << 0x25 | uVar43 >> 0x1b) ^ uVar34;
    uVar31 = uVar31 + uVar32;
    uVar48 = (uVar36 << 0x26 | uVar36 >> 0x1a) ^ uVar46;
    uVar42 = uVar42 + uVar50;
    uVar32 = (uVar32 << 0x13 | uVar32 >> 0x2d) ^ uVar31;
    uVar30 = uVar30 + uVar43;
    uVar35 = (uVar50 << 10 | uVar50 >> 0x36) ^ uVar42;
    uVar29 = uVar29 + uVar44;
    uVar43 = (uVar43 << 0x37 | uVar43 >> 9) ^ uVar30;
    uVar49 = uVar49 + uVar23;
    uVar44 = (uVar44 << 0x31 | uVar44 >> 0xf) ^ uVar29;
    uVar34 = uVar34 + uVar40;
    uVar37 = (uVar23 << 0x12 | uVar23 >> 0x2e) ^ uVar49;
    uVar47 = uVar47 + uVar41;
    uVar36 = (uVar40 << 0x17 | uVar40 >> 0x29) ^ uVar34;
    uVar46 = uVar46 + uVar44;
    uVar23 = (uVar41 << 0x34 | uVar41 >> 0xc) ^ uVar47;
    uVar42 = uVar42 + uVar23;
    uVar45 = (uVar44 << 0x21 | uVar44 >> 0x1f) ^ uVar46;
    uVar49 = uVar49 + uVar43;
    uVar50 = (uVar23 << 0xd | uVar23 >> 0x33) ^ uVar42;
    uVar34 = uVar34 + uVar32;
    uVar44 = (uVar43 << 0x22 | uVar43 >> 0x1e) ^ uVar49;
    uVar46 = uVar46 + uVar44;
    uVar23 = (uVar32 << 0x29 | uVar32 >> 0x17) ^ uVar34;
    uVar34 = uVar34 + uVar50;
    uVar39 = ((uVar50 << 0x2f | uVar50 >> 0x11) ^ uVar34) + uVar14;
    uVar50 = uVar13 + uVar39 + uVar46;
    uVar42 = uVar42 + uVar23;
    uVar43 = ((uVar23 << 0x30 | uVar23 >> 0x10) ^ uVar42) + uVar9 + uVar7;
    uVar31 = uVar31 + uVar36;
    uVar32 = (uVar36 << 4 | uVar36 >> 0x3c) ^ uVar31;
    uVar30 = uVar30 + uVar37;
    uVar23 = (uVar37 << 0x33 | uVar37 >> 0xd) ^ uVar30;
    uVar47 = uVar47 + uVar35;
    uVar35 = (uVar35 << 0x3b | uVar35 >> 5) ^ uVar47;
    uVar29 = uVar29 + uVar48;
    uVar41 = (uVar48 << 0x11 | uVar48 >> 0x2f) ^ uVar29;
    uVar31 = uVar31 + uVar35;
    uVar30 = uVar30 + uVar41;
    uVar47 = uVar47 + uVar32;
    uVar29 = uVar29 + uVar23;
    uVar49 = uVar49 + uVar45;
    uVar37 = (uVar39 << 0x29 | uVar39 >> 0x17) ^ uVar50;
    uVar39 = ((uVar23 << 0x10 | uVar23 >> 0x30) ^ uVar29) + uVar16;
    uVar23 = uVar31 + uVar15 + uVar39;
    uVar36 = ((uVar32 << 0x1c | uVar32 >> 0x24) ^ uVar47) + uVar17;
    uVar32 = uVar30 + uVar18 + uVar36;
    uVar40 = (uVar39 * 0x200 | uVar39 >> 0x37) ^ uVar23;
    uVar36 = (uVar36 << 0x25 | uVar36 >> 0x1b) ^ uVar32;
    uVar45 = ((uVar45 << 0x19 | uVar45 >> 0x27) ^ uVar49) + uVar19;
    uVar42 = uVar42 + uVar20 + uVar45;
    uVar30 = ((uVar41 << 0x29 | uVar41 >> 0x17) ^ uVar30) + uVar21;
    uVar39 = uVar47 + uVar22 + uVar30;
    uVar45 = (uVar45 * 0x80000000 | uVar45 >> 0x21) ^ uVar42;
    uVar47 = (uVar30 * 0x1000 | uVar30 >> 0x34) ^ uVar39;
    uVar31 = ((uVar35 << 0x14 | uVar35 >> 0x2c) ^ uVar31) + uVar4;
    uVar30 = uVar29 + uVar6 + uVar31;
    uVar35 = (uVar31 << 0x2f | uVar31 >> 0x11) ^ uVar30;
    uVar49 = uVar49 + uVar8 + uVar43;
    uVar31 = (uVar43 << 0x2c | uVar43 >> 0x14) ^ uVar49;
    uVar43 = ((uVar44 << 5 | uVar44 >> 0x3b) ^ uVar46) + uVar3 + 0x13;
    uVar29 = uVar34 + uVar11 + uVar10 + uVar43;
    uVar43 = (uVar43 * 0x40000000 | uVar43 >> 0x22) ^ uVar29;
    uVar50 = uVar50 + uVar47;
    uVar47 = (uVar47 << 0x10 | uVar47 >> 0x30) ^ uVar50;
    uVar32 = uVar32 + uVar43;
    uVar43 = (uVar43 << 0x33 | uVar43 >> 0xd) ^ uVar32;
    uVar30 = uVar30 + uVar45;
    uVar44 = (uVar45 << 4 | uVar45 >> 0x3c) ^ uVar30;
    uVar49 = uVar49 + uVar40;
    uVar40 = (uVar40 << 0x35 | uVar40 >> 0xb) ^ uVar49;
    uVar50 = uVar50 + uVar44;
    uVar44 = (uVar44 << 0x1f | uVar44 >> 0x21) ^ uVar50;
    uVar49 = uVar49 + uVar43;
    uVar43 = (uVar43 << 0x13 | uVar43 >> 0x2d) ^ uVar49;
    uVar50 = uVar50 + uVar43;
    *out = uVar50 + uVar14;
    uVar23 = uVar23 + uVar31;
    uVar31 = (uVar31 << 0x22 | uVar31 >> 0x1e) ^ uVar23;
    uVar42 = uVar42 + uVar35;
    uVar45 = (uVar35 << 0x38 | uVar35 >> 8) ^ uVar42;
    uVar29 = uVar29 + uVar36;
    uVar34 = (uVar36 << 0x2a | uVar36 >> 0x16) ^ uVar29;
    uVar39 = uVar39 + uVar37;
    uVar46 = (uVar37 << 0x29 | uVar37 >> 0x17) ^ uVar39;
    uVar42 = uVar42 + uVar46;
    uVar46 = (uVar46 << 0x2e | uVar46 >> 0x12) ^ uVar42;
    uVar29 = uVar29 + uVar31;
    uVar31 = (uVar31 << 0x2a | uVar31 >> 0x16) ^ uVar29;
    uVar29 = uVar29 + uVar46;
    out[1] = ((uVar46 << 0x17 | uVar46 >> 0x29) ^ uVar29) + uVar15;
    uVar23 = uVar23 + uVar34;
    uVar34 = (uVar34 << 0x2c | uVar34 >> 0x14) ^ uVar23;
    uVar39 = uVar39 + uVar45;
    uVar45 = (uVar45 << 0x2c | uVar45 >> 0x14) ^ uVar39;
    uVar23 = uVar23 + uVar45;
    out[2] = uVar23 + uVar16;
    uVar32 = uVar32 + uVar40;
    uVar46 = (uVar40 << 0x2f | uVar40 >> 0x11) ^ uVar32;
    uVar30 = uVar30 + uVar47;
    uVar35 = (uVar47 << 0x19 | uVar47 >> 0x27) ^ uVar30;
    uVar30 = uVar30 + uVar46;
    out[3] = ((uVar46 << 0x25 | uVar46 >> 0x1b) ^ uVar30) + uVar18;
    uVar32 = uVar32 + uVar35;
    out[4] = uVar32 + uVar17;
    uVar39 = uVar39 + uVar34;
    out[5] = ((uVar34 << 0x1f | uVar34 >> 0x21) ^ uVar39) + uVar20;
    uVar42 = uVar42 + uVar31;
    out[6] = uVar42 + uVar19;
    uVar49 = uVar49 + uVar44;
    out[7] = ((uVar44 << 0x14 | uVar44 >> 0x2c) ^ uVar49) + uVar22;
    out[8] = uVar39 + uVar21;
    out[9] = ((uVar35 << 0x34 | uVar35 >> 0xc) ^ uVar32) + uVar6;
    out[10] = uVar30 + uVar4;
    out[0xb] = ((uVar45 << 0x30 | uVar45 >> 0x10) ^ uVar23) + uVar8;
    out[0xc] = uVar49 + uVar7;
    out[0xd] = ((uVar31 << 0x23 | uVar31 >> 0x1d) ^ uVar42) + uVar11 + uVar10;
    out[0xe] = uVar5 + uVar3 + uVar29;
    out[0xf] = uVar12 + ((uVar43 << 9 | uVar43 >> 0x37) ^ uVar50) + 0x14;
    return;
  }
  if (uVar3 != 0x200) {
    if (uVar3 != 0x100) {
      return;
    }
    uVar3 = keyCtx->key[0];
    uVar12 = keyCtx->key[1];
    uVar13 = keyCtx->key[2];
    uVar14 = keyCtx->key[3];
    uVar15 = keyCtx->key[4];
    uVar16 = keyCtx->tweak[0];
    uVar17 = keyCtx->tweak[1];
    lVar1 = uVar16 + uVar12;
    uVar23 = in[1] + lVar1;
    uVar31 = *in + uVar3 + uVar23;
    uVar23 = (uVar23 * 0x4000 | uVar23 >> 0x32) ^ uVar31;
    uVar42 = in[3] + uVar14;
    lVar2 = uVar13 + uVar17;
    uVar29 = in[2] + lVar2 + uVar42;
    uVar42 = (uVar42 * 0x10000 | uVar42 >> 0x30) ^ uVar29;
    uVar31 = uVar31 + uVar42;
    uVar42 = (uVar42 << 0x34 | uVar42 >> 0xc) ^ uVar31;
    uVar29 = uVar29 + uVar23;
    uVar23 = (uVar23 << 0x39 | uVar23 >> 7) ^ uVar29;
    uVar31 = uVar31 + uVar23;
    uVar23 = (uVar23 << 0x17 | uVar23 >> 0x29) ^ uVar31;
    uVar29 = uVar29 + uVar42;
    uVar43 = (uVar42 << 0x28 | uVar42 >> 0x18) ^ uVar29;
    uVar31 = uVar31 + uVar43;
    uVar18 = keyCtx->tweak[2];
    uVar29 = uVar29 + uVar23;
    uVar23 = ((uVar23 << 0x25 | uVar23 >> 0x1b) ^ uVar29) + lVar2;
    uVar32 = uVar31 + uVar12 + uVar23;
    uVar42 = (uVar23 * 0x2000000 | uVar23 >> 0x27) ^ uVar32;
    uVar23 = uVar15 + ((uVar43 << 5 | uVar43 >> 0x3b) ^ uVar31) + 1;
    lVar24 = uVar14 + uVar18;
    uVar29 = uVar29 + lVar24 + uVar23;
    uVar23 = (uVar23 << 0x21 | uVar23 >> 0x1f) ^ uVar29;
    uVar32 = uVar32 + uVar23;
    uVar23 = (uVar23 << 0x2e | uVar23 >> 0x12) ^ uVar32;
    uVar29 = uVar29 + uVar42;
    uVar42 = (uVar42 << 0xc | uVar42 >> 0x34) ^ uVar29;
    uVar32 = uVar32 + uVar42;
    uVar42 = (uVar42 << 0x3a | uVar42 >> 6) ^ uVar32;
    uVar29 = uVar29 + uVar23;
    uVar23 = (uVar23 << 0x16 | uVar23 >> 0x2a) ^ uVar29;
    uVar32 = uVar32 + uVar23;
    uVar29 = uVar29 + uVar42;
    uVar42 = ((uVar42 << 0x20 | uVar42 >> 0x20) ^ uVar29) + lVar24;
    uVar31 = uVar32 + uVar13 + uVar42;
    uVar42 = (uVar42 * 0x4000 | uVar42 >> 0x32) ^ uVar31;
    uVar23 = ((uVar23 << 0x20 | uVar23 >> 0x20) ^ uVar32) + uVar3 + 2;
    lVar25 = uVar16 + uVar15;
    uVar29 = uVar29 + lVar25 + uVar23;
    uVar23 = (uVar23 * 0x10000 | uVar23 >> 0x30) ^ uVar29;
    uVar31 = uVar31 + uVar23;
    uVar23 = (uVar23 << 0x34 | uVar23 >> 0xc) ^ uVar31;
    uVar29 = uVar29 + uVar42;
    uVar42 = (uVar42 << 0x39 | uVar42 >> 7) ^ uVar29;
    uVar31 = uVar31 + uVar42;
    uVar42 = (uVar42 << 0x17 | uVar42 >> 0x29) ^ uVar31;
    uVar29 = uVar29 + uVar23;
    uVar23 = (uVar23 << 0x28 | uVar23 >> 0x18) ^ uVar29;
    uVar31 = uVar31 + uVar23;
    uVar29 = uVar29 + uVar42;
    uVar42 = ((uVar42 << 0x25 | uVar42 >> 0x1b) ^ uVar29) + lVar25;
    uVar32 = uVar31 + uVar14 + uVar42;
    uVar42 = (uVar42 * 0x2000000 | uVar42 >> 0x27) ^ uVar32;
    uVar23 = ((uVar23 << 5 | uVar23 >> 0x3b) ^ uVar31) + uVar12 + 3;
    lVar26 = uVar3 + uVar17;
    uVar29 = uVar29 + lVar26 + uVar23;
    uVar23 = (uVar23 << 0x21 | uVar23 >> 0x1f) ^ uVar29;
    uVar32 = uVar32 + uVar23;
    uVar23 = (uVar23 << 0x2e | uVar23 >> 0x12) ^ uVar32;
    uVar29 = uVar29 + uVar42;
    uVar42 = (uVar42 << 0xc | uVar42 >> 0x34) ^ uVar29;
    uVar32 = uVar32 + uVar42;
    uVar42 = (uVar42 << 0x3a | uVar42 >> 6) ^ uVar32;
    uVar29 = uVar29 + uVar23;
    uVar23 = (uVar23 << 0x16 | uVar23 >> 0x2a) ^ uVar29;
    uVar32 = uVar32 + uVar23;
    uVar29 = uVar29 + uVar42;
    uVar42 = ((uVar42 << 0x20 | uVar42 >> 0x20) ^ uVar29) + lVar26;
    uVar31 = uVar32 + uVar15 + uVar42;
    uVar42 = (uVar42 * 0x4000 | uVar42 >> 0x32) ^ uVar31;
    uVar23 = ((uVar23 << 0x20 | uVar23 >> 0x20) ^ uVar32) + uVar13 + 4;
    uVar29 = uVar29 + uVar12 + uVar18 + uVar23;
    uVar23 = (uVar23 * 0x10000 | uVar23 >> 0x30) ^ uVar29;
    uVar31 = uVar31 + uVar23;
    uVar23 = (uVar23 << 0x34 | uVar23 >> 0xc) ^ uVar31;
    uVar29 = uVar29 + uVar42;
    uVar42 = (uVar42 << 0x39 | uVar42 >> 7) ^ uVar29;
    uVar31 = uVar31 + uVar42;
    uVar42 = (uVar42 << 0x17 | uVar42 >> 0x29) ^ uVar31;
    uVar29 = uVar29 + uVar23;
    uVar23 = (uVar23 << 0x28 | uVar23 >> 0x18) ^ uVar29;
    uVar29 = uVar29 + uVar42;
    uVar42 = ((uVar42 << 0x25 | uVar42 >> 0x1b) ^ uVar29) + uVar12 + uVar18;
    uVar31 = uVar31 + uVar23;
    uVar32 = uVar31 + uVar3 + uVar42;
    uVar42 = (uVar42 * 0x2000000 | uVar42 >> 0x27) ^ uVar32;
    uVar23 = ((uVar23 << 5 | uVar23 >> 0x3b) ^ uVar31) + uVar14 + 5;
    uVar29 = uVar29 + uVar16 + uVar13 + uVar23;
    uVar23 = (uVar23 << 0x21 | uVar23 >> 0x1f) ^ uVar29;
    uVar32 = uVar32 + uVar23;
    uVar23 = (uVar23 << 0x2e | uVar23 >> 0x12) ^ uVar32;
    uVar29 = uVar29 + uVar42;
    uVar42 = (uVar42 << 0xc | uVar42 >> 0x34) ^ uVar29;
    uVar32 = uVar32 + uVar42;
    uVar42 = (uVar42 << 0x3a | uVar42 >> 6) ^ uVar32;
    uVar29 = uVar29 + uVar23;
    uVar23 = (uVar23 << 0x16 | uVar23 >> 0x2a) ^ uVar29;
    uVar29 = uVar29 + uVar42;
    uVar42 = ((uVar42 << 0x20 | uVar42 >> 0x20) ^ uVar29) + uVar16 + uVar13;
    uVar32 = uVar32 + uVar23;
    uVar31 = uVar32 + uVar12 + uVar42;
    uVar42 = (uVar42 * 0x4000 | uVar42 >> 0x32) ^ uVar31;
    uVar23 = ((uVar23 << 0x20 | uVar23 >> 0x20) ^ uVar32) + uVar15 + 6;
    uVar29 = uVar29 + uVar14 + uVar17 + uVar23;
    uVar23 = (uVar23 * 0x10000 | uVar23 >> 0x30) ^ uVar29;
    uVar31 = uVar31 + uVar23;
    uVar23 = (uVar23 << 0x34 | uVar23 >> 0xc) ^ uVar31;
    uVar29 = uVar29 + uVar42;
    uVar42 = (uVar42 << 0x39 | uVar42 >> 7) ^ uVar29;
    uVar31 = uVar31 + uVar42;
    uVar42 = (uVar42 << 0x17 | uVar42 >> 0x29) ^ uVar31;
    uVar29 = uVar29 + uVar23;
    uVar23 = (uVar23 << 0x28 | uVar23 >> 0x18) ^ uVar29;
    uVar29 = uVar29 + uVar42;
    uVar42 = ((uVar42 << 0x25 | uVar42 >> 0x1b) ^ uVar29) + uVar14 + uVar17;
    uVar31 = uVar31 + uVar23;
    uVar32 = uVar31 + uVar13 + uVar42;
    uVar42 = (uVar42 * 0x2000000 | uVar42 >> 0x27) ^ uVar32;
    uVar23 = ((uVar23 << 5 | uVar23 >> 0x3b) ^ uVar31) + uVar3 + 7;
    uVar29 = uVar29 + uVar15 + uVar18 + uVar23;
    uVar23 = (uVar23 << 0x21 | uVar23 >> 0x1f) ^ uVar29;
    uVar32 = uVar32 + uVar23;
    uVar23 = (uVar23 << 0x2e | uVar23 >> 0x12) ^ uVar32;
    uVar29 = uVar29 + uVar42;
    uVar42 = (uVar42 << 0xc | uVar42 >> 0x34) ^ uVar29;
    uVar32 = uVar32 + uVar42;
    uVar42 = (uVar42 << 0x3a | uVar42 >> 6) ^ uVar32;
    uVar29 = uVar29 + uVar23;
    uVar23 = (uVar23 << 0x16 | uVar23 >> 0x2a) ^ uVar29;
    uVar29 = uVar29 + uVar42;
    uVar42 = ((uVar42 << 0x20 | uVar42 >> 0x20) ^ uVar29) + uVar15 + uVar18;
    uVar32 = uVar32 + uVar23;
    uVar31 = uVar32 + uVar14 + uVar42;
    uVar42 = (uVar42 * 0x4000 | uVar42 >> 0x32) ^ uVar31;
    uVar23 = ((uVar23 << 0x20 | uVar23 >> 0x20) ^ uVar32) + uVar12 + 8;
    uVar29 = uVar29 + uVar16 + uVar3 + uVar23;
    uVar23 = (uVar23 * 0x10000 | uVar23 >> 0x30) ^ uVar29;
    uVar31 = uVar31 + uVar23;
    uVar23 = (uVar23 << 0x34 | uVar23 >> 0xc) ^ uVar31;
    uVar29 = uVar29 + uVar42;
    uVar42 = (uVar42 << 0x39 | uVar42 >> 7) ^ uVar29;
    uVar31 = uVar31 + uVar42;
    uVar42 = (uVar42 << 0x17 | uVar42 >> 0x29) ^ uVar31;
    uVar29 = uVar29 + uVar23;
    uVar23 = (uVar23 << 0x28 | uVar23 >> 0x18) ^ uVar29;
    uVar29 = uVar29 + uVar42;
    uVar42 = ((uVar42 << 0x25 | uVar42 >> 0x1b) ^ uVar29) + uVar16 + uVar3;
    uVar31 = uVar31 + uVar23;
    uVar32 = uVar31 + uVar15 + uVar42;
    uVar42 = (uVar42 * 0x2000000 | uVar42 >> 0x27) ^ uVar32;
    uVar23 = ((uVar23 << 5 | uVar23 >> 0x3b) ^ uVar31) + uVar13 + 9;
    uVar29 = uVar29 + uVar12 + uVar17 + uVar23;
    uVar23 = (uVar23 << 0x21 | uVar23 >> 0x1f) ^ uVar29;
    uVar32 = uVar32 + uVar23;
    uVar23 = (uVar23 << 0x2e | uVar23 >> 0x12) ^ uVar32;
    uVar29 = uVar29 + uVar42;
    uVar42 = (uVar42 << 0xc | uVar42 >> 0x34) ^ uVar29;
    uVar32 = uVar32 + uVar42;
    uVar42 = (uVar42 << 0x3a | uVar42 >> 6) ^ uVar32;
    uVar29 = uVar29 + uVar23;
    uVar23 = (uVar23 << 0x16 | uVar23 >> 0x2a) ^ uVar29;
    uVar29 = uVar29 + uVar42;
    uVar42 = ((uVar42 << 0x20 | uVar42 >> 0x20) ^ uVar29) + uVar12 + uVar17;
    uVar32 = uVar32 + uVar23;
    uVar31 = uVar32 + uVar3 + uVar42;
    uVar42 = (uVar42 * 0x4000 | uVar42 >> 0x32) ^ uVar31;
    uVar23 = ((uVar23 << 0x20 | uVar23 >> 0x20) ^ uVar32) + uVar14 + 10;
    uVar29 = uVar29 + uVar13 + uVar18 + uVar23;
    uVar23 = (uVar23 * 0x10000 | uVar23 >> 0x30) ^ uVar29;
    uVar31 = uVar31 + uVar23;
    uVar23 = (uVar23 << 0x34 | uVar23 >> 0xc) ^ uVar31;
    uVar29 = uVar29 + uVar42;
    uVar42 = (uVar42 << 0x39 | uVar42 >> 7) ^ uVar29;
    uVar31 = uVar31 + uVar42;
    uVar42 = (uVar42 << 0x17 | uVar42 >> 0x29) ^ uVar31;
    uVar29 = uVar29 + uVar23;
    uVar23 = (uVar23 << 0x28 | uVar23 >> 0x18) ^ uVar29;
    uVar29 = uVar29 + uVar42;
    uVar42 = ((uVar42 << 0x25 | uVar42 >> 0x1b) ^ uVar29) + uVar13 + uVar18;
    uVar31 = uVar31 + uVar23;
    uVar32 = uVar31 + uVar12 + uVar42;
    uVar42 = (uVar42 * 0x2000000 | uVar42 >> 0x27) ^ uVar32;
    uVar23 = ((uVar23 << 5 | uVar23 >> 0x3b) ^ uVar31) + uVar15 + 0xb;
    uVar29 = uVar29 + uVar16 + uVar14 + uVar23;
    uVar23 = (uVar23 << 0x21 | uVar23 >> 0x1f) ^ uVar29;
    uVar32 = uVar32 + uVar23;
    uVar23 = (uVar23 << 0x2e | uVar23 >> 0x12) ^ uVar32;
    uVar29 = uVar29 + uVar42;
    uVar42 = (uVar42 << 0xc | uVar42 >> 0x34) ^ uVar29;
    uVar32 = uVar32 + uVar42;
    uVar42 = (uVar42 << 0x3a | uVar42 >> 6) ^ uVar32;
    uVar29 = uVar29 + uVar23;
    uVar23 = (uVar23 << 0x16 | uVar23 >> 0x2a) ^ uVar29;
    uVar29 = uVar29 + uVar42;
    uVar42 = ((uVar42 << 0x20 | uVar42 >> 0x20) ^ uVar29) + uVar16 + uVar14;
    uVar32 = uVar32 + uVar23;
    uVar31 = uVar32 + uVar13 + uVar42;
    uVar42 = (uVar42 * 0x4000 | uVar42 >> 0x32) ^ uVar31;
    uVar23 = ((uVar23 << 0x20 | uVar23 >> 0x20) ^ uVar32) + uVar3 + 0xc;
    uVar29 = uVar29 + uVar17 + uVar15 + uVar23;
    uVar23 = (uVar23 * 0x10000 | uVar23 >> 0x30) ^ uVar29;
    uVar31 = uVar31 + uVar23;
    uVar23 = (uVar23 << 0x34 | uVar23 >> 0xc) ^ uVar31;
    uVar29 = uVar29 + uVar42;
    uVar42 = (uVar42 << 0x39 | uVar42 >> 7) ^ uVar29;
    uVar31 = uVar31 + uVar42;
    uVar42 = (uVar42 << 0x17 | uVar42 >> 0x29) ^ uVar31;
    uVar29 = uVar29 + uVar23;
    uVar23 = (uVar23 << 0x28 | uVar23 >> 0x18) ^ uVar29;
    uVar29 = uVar29 + uVar42;
    uVar42 = ((uVar42 << 0x25 | uVar42 >> 0x1b) ^ uVar29) + uVar17 + uVar15;
    uVar31 = uVar31 + uVar23;
    uVar32 = uVar31 + uVar14 + uVar42;
    uVar42 = (uVar42 * 0x2000000 | uVar42 >> 0x27) ^ uVar32;
    uVar23 = ((uVar23 << 5 | uVar23 >> 0x3b) ^ uVar31) + uVar12 + 0xd;
    uVar29 = uVar29 + uVar18 + uVar3 + uVar23;
    uVar23 = (uVar23 << 0x21 | uVar23 >> 0x1f) ^ uVar29;
    uVar32 = uVar32 + uVar23;
    uVar23 = (uVar23 << 0x2e | uVar23 >> 0x12) ^ uVar32;
    uVar29 = uVar29 + uVar42;
    uVar42 = (uVar42 << 0xc | uVar42 >> 0x34) ^ uVar29;
    uVar32 = uVar32 + uVar42;
    uVar42 = (uVar42 << 0x3a | uVar42 >> 6) ^ uVar32;
    uVar29 = uVar29 + uVar23;
    uVar23 = (uVar23 << 0x16 | uVar23 >> 0x2a) ^ uVar29;
    uVar29 = uVar29 + uVar42;
    uVar42 = ((uVar42 << 0x20 | uVar42 >> 0x20) ^ uVar29) + uVar18 + uVar3;
    uVar32 = uVar32 + uVar23;
    uVar31 = uVar32 + uVar15 + uVar42;
    uVar42 = (uVar42 * 0x4000 | uVar42 >> 0x32) ^ uVar31;
    uVar23 = ((uVar23 << 0x20 | uVar23 >> 0x20) ^ uVar32) + uVar13 + 0xe;
    uVar29 = uVar29 + lVar1 + uVar23;
    uVar23 = (uVar23 * 0x10000 | uVar23 >> 0x30) ^ uVar29;
    uVar31 = uVar31 + uVar23;
    uVar23 = (uVar23 << 0x34 | uVar23 >> 0xc) ^ uVar31;
    uVar29 = uVar29 + uVar42;
    uVar42 = (uVar42 << 0x39 | uVar42 >> 7) ^ uVar29;
    uVar31 = uVar31 + uVar42;
    uVar42 = (uVar42 << 0x17 | uVar42 >> 0x29) ^ uVar31;
    uVar29 = uVar29 + uVar23;
    uVar23 = (uVar23 << 0x28 | uVar23 >> 0x18) ^ uVar29;
    uVar29 = uVar29 + uVar42;
    uVar42 = ((uVar42 << 0x25 | uVar42 >> 0x1b) ^ uVar29) + lVar1;
    uVar31 = uVar31 + uVar23;
    uVar32 = uVar31 + uVar3 + uVar42;
    uVar42 = (uVar42 * 0x2000000 | uVar42 >> 0x27) ^ uVar32;
    uVar23 = ((uVar23 << 5 | uVar23 >> 0x3b) ^ uVar31) + uVar14 + 0xf;
    uVar31 = uVar29 + lVar2 + uVar23;
    uVar23 = (uVar23 << 0x21 | uVar23 >> 0x1f) ^ uVar31;
    uVar32 = uVar32 + uVar23;
    uVar23 = (uVar23 << 0x2e | uVar23 >> 0x12) ^ uVar32;
    uVar31 = uVar31 + uVar42;
    uVar42 = (uVar42 << 0xc | uVar42 >> 0x34) ^ uVar31;
    uVar32 = uVar32 + uVar42;
    uVar42 = (uVar42 << 0x3a | uVar42 >> 6) ^ uVar32;
    uVar31 = uVar31 + uVar23;
    uVar23 = (uVar23 << 0x16 | uVar23 >> 0x2a) ^ uVar31;
    uVar31 = uVar31 + uVar42;
    uVar42 = ((uVar42 << 0x20 | uVar42 >> 0x20) ^ uVar31) + lVar2;
    uVar32 = uVar32 + uVar23;
    uVar29 = uVar15 + ((uVar23 << 0x20 | uVar23 >> 0x20) ^ uVar32) + 0x10;
    uVar32 = uVar32 + uVar12 + uVar42;
    uVar23 = (uVar42 * 0x4000 | uVar42 >> 0x32) ^ uVar32;
    uVar31 = uVar31 + lVar24 + uVar29;
    uVar42 = (uVar29 * 0x10000 | uVar29 >> 0x30) ^ uVar31;
    uVar32 = uVar32 + uVar42;
    uVar42 = (uVar42 << 0x34 | uVar42 >> 0xc) ^ uVar32;
    uVar31 = uVar31 + uVar23;
    uVar23 = (uVar23 << 0x39 | uVar23 >> 7) ^ uVar31;
    uVar32 = uVar32 + uVar23;
    uVar23 = (uVar23 << 0x17 | uVar23 >> 0x29) ^ uVar32;
    uVar31 = uVar31 + uVar42;
    uVar29 = (uVar42 << 0x28 | uVar42 >> 0x18) ^ uVar31;
    uVar31 = uVar31 + uVar23;
    uVar42 = ((uVar23 << 0x25 | uVar23 >> 0x1b) ^ uVar31) + lVar24;
    uVar32 = uVar32 + uVar29;
    uVar23 = uVar3 + ((uVar29 << 5 | uVar29 >> 0x3b) ^ uVar32) + 0x11;
    uVar32 = uVar32 + uVar13 + uVar42;
    uVar42 = (uVar42 * 0x2000000 | uVar42 >> 0x27) ^ uVar32;
    uVar29 = uVar31 + lVar25 + uVar23;
    uVar23 = (uVar23 << 0x21 | uVar23 >> 0x1f) ^ uVar29;
    uVar32 = uVar32 + uVar23;
    uVar23 = (uVar23 << 0x2e | uVar23 >> 0x12) ^ uVar32;
    uVar29 = uVar29 + uVar42;
    uVar42 = (uVar42 << 0xc | uVar42 >> 0x34) ^ uVar29;
    uVar32 = uVar32 + uVar42;
    uVar42 = (uVar42 << 0x3a | uVar42 >> 6) ^ uVar32;
    uVar29 = uVar29 + uVar23;
    uVar23 = (uVar23 << 0x16 | uVar23 >> 0x2a) ^ uVar29;
    uVar32 = uVar32 + uVar23;
    uVar29 = uVar29 + uVar42;
    *out = uVar32 + uVar14;
    out[1] = ((uVar42 << 0x20 | uVar42 >> 0x20) ^ uVar29) + lVar25;
    out[2] = uVar29 + lVar26;
    out[3] = ((uVar23 << 0x20 | uVar23 >> 0x20) ^ uVar32) + uVar12 + 0x12;
    return;
  }
  uVar3 = keyCtx->key[0];
  uVar12 = keyCtx->key[1];
  uVar13 = keyCtx->key[2];
  uVar14 = keyCtx->key[3];
  uVar15 = keyCtx->key[4];
  uVar16 = keyCtx->key[5];
  uVar17 = keyCtx->key[6];
  uVar18 = keyCtx->key[7];
  uVar19 = keyCtx->key[8];
  uVar20 = keyCtx->tweak[0];
  uVar21 = keyCtx->tweak[1];
  uVar22 = keyCtx->tweak[2];
  uVar23 = in[1] + uVar12;
  uVar44 = *in + uVar3 + uVar23;
  uVar31 = (uVar23 << 0x2e | uVar23 >> 0x12) ^ uVar44;
  uVar23 = in[3] + uVar14;
  uVar49 = in[2] + uVar13 + uVar23;
  uVar32 = (uVar23 << 0x24 | uVar23 >> 0x1c) ^ uVar49;
  lVar28 = uVar20 + uVar16;
  uVar23 = in[5] + lVar28;
  uVar42 = in[4] + uVar15 + uVar23;
  uVar43 = (uVar23 * 0x80000 | uVar23 >> 0x2d) ^ uVar42;
  uVar23 = in[7] + uVar18;
  lVar1 = uVar21 + uVar17;
  uVar29 = in[6] + lVar1 + uVar23;
  uVar23 = (uVar23 << 0x25 | uVar23 >> 0x1b) ^ uVar29;
  uVar49 = uVar49 + uVar31;
  uVar31 = (uVar31 << 0x21 | uVar31 >> 0x1f) ^ uVar49;
  uVar42 = uVar42 + uVar23;
  uVar23 = (uVar23 << 0x1b | uVar23 >> 0x25) ^ uVar42;
  uVar29 = uVar29 + uVar43;
  uVar43 = (uVar43 << 0xe | uVar43 >> 0x32) ^ uVar29;
  uVar44 = uVar44 + uVar32;
  uVar32 = (uVar32 << 0x2a | uVar32 >> 0x16) ^ uVar44;
  uVar42 = uVar42 + uVar31;
  uVar31 = (uVar31 << 0x11 | uVar31 >> 0x2f) ^ uVar42;
  uVar29 = uVar29 + uVar32;
  uVar32 = (uVar32 << 0x31 | uVar32 >> 0xf) ^ uVar29;
  uVar44 = uVar44 + uVar43;
  uVar43 = (uVar43 << 0x24 | uVar43 >> 0x1c) ^ uVar44;
  uVar49 = uVar49 + uVar23;
  uVar23 = (uVar23 << 0x27 | uVar23 >> 0x19) ^ uVar49;
  uVar29 = uVar29 + uVar31;
  uVar44 = uVar44 + uVar23;
  uVar49 = uVar49 + uVar43;
  uVar42 = uVar42 + uVar32;
  uVar31 = ((uVar31 << 0x2c | uVar31 >> 0x14) ^ uVar29) + uVar13;
  uVar45 = uVar44 + uVar12 + uVar31;
  uVar31 = (uVar31 << 0x27 | uVar31 >> 0x19) ^ uVar45;
  uVar32 = ((uVar32 << 0x38 | uVar32 >> 8) ^ uVar42) + uVar15;
  uVar50 = uVar49 + uVar14 + uVar32;
  uVar32 = (uVar32 * 0x40000000 | uVar32 >> 0x22) ^ uVar50;
  uVar43 = ((uVar43 << 0x36 | uVar43 >> 10) ^ uVar49) + lVar1;
  uVar42 = uVar42 + uVar16 + uVar43;
  uVar23 = ((uVar23 << 9 | uVar23 >> 0x37) ^ uVar44) + uVar19 + 1;
  lVar24 = uVar22 + uVar18;
  uVar29 = uVar29 + lVar24 + uVar23;
  uVar43 = (uVar43 << 0x22 | uVar43 >> 0x1e) ^ uVar42;
  uVar50 = uVar50 + uVar31;
  uVar23 = (uVar23 * 0x1000000 | uVar23 >> 0x28) ^ uVar29;
  uVar42 = uVar42 + uVar23;
  uVar31 = (uVar31 << 0xd | uVar31 >> 0x33) ^ uVar50;
  uVar29 = uVar29 + uVar43;
  uVar23 = (uVar23 << 0x32 | uVar23 >> 0xe) ^ uVar42;
  uVar45 = uVar45 + uVar32;
  uVar43 = (uVar43 << 10 | uVar43 >> 0x36) ^ uVar29;
  uVar42 = uVar42 + uVar31;
  uVar32 = (uVar32 << 0x11 | uVar32 >> 0x2f) ^ uVar45;
  uVar29 = uVar29 + uVar32;
  uVar31 = (uVar31 << 0x19 | uVar31 >> 0x27) ^ uVar42;
  uVar45 = uVar45 + uVar43;
  uVar32 = (uVar32 << 0x1d | uVar32 >> 0x23) ^ uVar29;
  uVar50 = uVar50 + uVar23;
  uVar43 = (uVar43 << 0x27 | uVar43 >> 0x19) ^ uVar45;
  uVar29 = uVar29 + uVar31;
  uVar23 = (uVar23 << 0x2b | uVar23 >> 0x15) ^ uVar50;
  uVar45 = uVar45 + uVar23;
  uVar50 = uVar50 + uVar43;
  uVar42 = uVar42 + uVar32;
  uVar31 = ((uVar31 << 8 | uVar31 >> 0x38) ^ uVar29) + uVar14;
  uVar44 = uVar45 + uVar13 + uVar31;
  uVar32 = ((uVar32 << 0x16 | uVar32 >> 0x2a) ^ uVar42) + uVar16;
  uVar49 = uVar50 + uVar15 + uVar32;
  uVar31 = (uVar31 << 0x2e | uVar31 >> 0x12) ^ uVar44;
  uVar32 = (uVar32 << 0x24 | uVar32 >> 0x1c) ^ uVar49;
  uVar43 = ((uVar43 << 0x38 | uVar43 >> 8) ^ uVar50) + lVar24;
  uVar42 = uVar42 + uVar17 + uVar43;
  uVar43 = (uVar43 * 0x80000 | uVar43 >> 0x2d) ^ uVar42;
  uVar23 = ((uVar23 << 0x23 | uVar23 >> 0x1d) ^ uVar45) + uVar3 + 2;
  lVar25 = uVar20 + uVar19;
  uVar29 = uVar29 + lVar25 + uVar23;
  uVar23 = (uVar23 << 0x25 | uVar23 >> 0x1b) ^ uVar29;
  uVar49 = uVar49 + uVar31;
  uVar31 = (uVar31 << 0x21 | uVar31 >> 0x1f) ^ uVar49;
  uVar42 = uVar42 + uVar23;
  uVar23 = (uVar23 << 0x1b | uVar23 >> 0x25) ^ uVar42;
  uVar29 = uVar29 + uVar43;
  uVar43 = (uVar43 << 0xe | uVar43 >> 0x32) ^ uVar29;
  uVar44 = uVar44 + uVar32;
  uVar32 = (uVar32 << 0x2a | uVar32 >> 0x16) ^ uVar44;
  uVar42 = uVar42 + uVar31;
  uVar31 = (uVar31 << 0x11 | uVar31 >> 0x2f) ^ uVar42;
  uVar29 = uVar29 + uVar32;
  uVar32 = (uVar32 << 0x31 | uVar32 >> 0xf) ^ uVar29;
  uVar44 = uVar44 + uVar43;
  uVar43 = (uVar43 << 0x24 | uVar43 >> 0x1c) ^ uVar44;
  uVar49 = uVar49 + uVar23;
  uVar23 = (uVar23 << 0x27 | uVar23 >> 0x19) ^ uVar49;
  uVar29 = uVar29 + uVar31;
  uVar44 = uVar44 + uVar23;
  uVar49 = uVar49 + uVar43;
  uVar42 = uVar42 + uVar32;
  uVar31 = ((uVar31 << 0x2c | uVar31 >> 0x14) ^ uVar29) + uVar15;
  uVar45 = uVar44 + uVar14 + uVar31;
  uVar31 = (uVar31 << 0x27 | uVar31 >> 0x19) ^ uVar45;
  uVar32 = ((uVar32 << 0x38 | uVar32 >> 8) ^ uVar42) + uVar17;
  uVar50 = uVar49 + uVar16 + uVar32;
  uVar32 = (uVar32 * 0x40000000 | uVar32 >> 0x22) ^ uVar50;
  uVar43 = ((uVar43 << 0x36 | uVar43 >> 10) ^ uVar49) + lVar25;
  uVar42 = uVar42 + uVar18 + uVar43;
  uVar43 = (uVar43 << 0x22 | uVar43 >> 0x1e) ^ uVar42;
  uVar23 = ((uVar23 << 9 | uVar23 >> 0x37) ^ uVar44) + uVar12 + 3;
  lVar33 = uVar21 + uVar3;
  uVar29 = uVar29 + lVar33 + uVar23;
  uVar23 = (uVar23 * 0x1000000 | uVar23 >> 0x28) ^ uVar29;
  uVar50 = uVar50 + uVar31;
  uVar31 = (uVar31 << 0xd | uVar31 >> 0x33) ^ uVar50;
  uVar42 = uVar42 + uVar23;
  uVar23 = (uVar23 << 0x32 | uVar23 >> 0xe) ^ uVar42;
  uVar29 = uVar29 + uVar43;
  uVar43 = (uVar43 << 10 | uVar43 >> 0x36) ^ uVar29;
  uVar45 = uVar45 + uVar32;
  uVar32 = (uVar32 << 0x11 | uVar32 >> 0x2f) ^ uVar45;
  uVar42 = uVar42 + uVar31;
  uVar31 = (uVar31 << 0x19 | uVar31 >> 0x27) ^ uVar42;
  uVar29 = uVar29 + uVar32;
  uVar32 = (uVar32 << 0x1d | uVar32 >> 0x23) ^ uVar29;
  uVar45 = uVar45 + uVar43;
  uVar43 = (uVar43 << 0x27 | uVar43 >> 0x19) ^ uVar45;
  uVar50 = uVar50 + uVar23;
  uVar23 = (uVar23 << 0x2b | uVar23 >> 0x15) ^ uVar50;
  uVar29 = uVar29 + uVar31;
  uVar45 = uVar45 + uVar23;
  uVar50 = uVar50 + uVar43;
  uVar42 = uVar42 + uVar32;
  uVar31 = ((uVar31 << 8 | uVar31 >> 0x38) ^ uVar29) + uVar16;
  uVar44 = uVar45 + uVar15 + uVar31;
  uVar31 = (uVar31 << 0x2e | uVar31 >> 0x12) ^ uVar44;
  uVar32 = ((uVar32 << 0x16 | uVar32 >> 0x2a) ^ uVar42) + uVar18;
  uVar49 = uVar50 + uVar17 + uVar32;
  uVar43 = ((uVar43 << 0x38 | uVar43 >> 8) ^ uVar50) + lVar33;
  uVar42 = uVar42 + uVar19 + uVar43;
  uVar32 = (uVar32 << 0x24 | uVar32 >> 0x1c) ^ uVar49;
  uVar43 = (uVar43 * 0x80000 | uVar43 >> 0x2d) ^ uVar42;
  uVar23 = ((uVar23 << 0x23 | uVar23 >> 0x1d) ^ uVar45) + uVar13 + 4;
  lVar2 = uVar22 + uVar12;
  uVar29 = uVar29 + lVar2 + uVar23;
  uVar23 = (uVar23 << 0x25 | uVar23 >> 0x1b) ^ uVar29;
  uVar49 = uVar49 + uVar31;
  uVar31 = (uVar31 << 0x21 | uVar31 >> 0x1f) ^ uVar49;
  uVar42 = uVar42 + uVar23;
  uVar23 = (uVar23 << 0x1b | uVar23 >> 0x25) ^ uVar42;
  uVar29 = uVar29 + uVar43;
  uVar43 = (uVar43 << 0xe | uVar43 >> 0x32) ^ uVar29;
  uVar44 = uVar44 + uVar32;
  uVar32 = (uVar32 << 0x2a | uVar32 >> 0x16) ^ uVar44;
  uVar42 = uVar42 + uVar31;
  uVar31 = (uVar31 << 0x11 | uVar31 >> 0x2f) ^ uVar42;
  uVar29 = uVar29 + uVar32;
  uVar32 = (uVar32 << 0x31 | uVar32 >> 0xf) ^ uVar29;
  uVar44 = uVar44 + uVar43;
  uVar43 = (uVar43 << 0x24 | uVar43 >> 0x1c) ^ uVar44;
  uVar49 = uVar49 + uVar23;
  uVar23 = (uVar23 << 0x27 | uVar23 >> 0x19) ^ uVar49;
  uVar29 = uVar29 + uVar31;
  uVar44 = uVar44 + uVar23;
  uVar49 = uVar49 + uVar43;
  uVar42 = uVar42 + uVar32;
  uVar31 = ((uVar31 << 0x2c | uVar31 >> 0x14) ^ uVar29) + uVar17;
  uVar45 = uVar44 + uVar16 + uVar31;
  uVar31 = (uVar31 << 0x27 | uVar31 >> 0x19) ^ uVar45;
  uVar32 = ((uVar32 << 0x38 | uVar32 >> 8) ^ uVar42) + uVar19;
  uVar50 = uVar49 + uVar18 + uVar32;
  uVar32 = (uVar32 * 0x40000000 | uVar32 >> 0x22) ^ uVar50;
  uVar43 = ((uVar43 << 0x36 | uVar43 >> 10) ^ uVar49) + lVar2;
  uVar42 = uVar42 + uVar3 + uVar43;
  uVar23 = ((uVar23 << 9 | uVar23 >> 0x37) ^ uVar44) + uVar14 + 5;
  lVar27 = uVar20 + uVar13;
  uVar29 = uVar29 + lVar27 + uVar23;
  uVar43 = (uVar43 << 0x22 | uVar43 >> 0x1e) ^ uVar42;
  uVar50 = uVar50 + uVar31;
  uVar23 = (uVar23 * 0x1000000 | uVar23 >> 0x28) ^ uVar29;
  uVar42 = uVar42 + uVar23;
  uVar31 = (uVar31 << 0xd | uVar31 >> 0x33) ^ uVar50;
  uVar29 = uVar29 + uVar43;
  uVar23 = (uVar23 << 0x32 | uVar23 >> 0xe) ^ uVar42;
  uVar45 = uVar45 + uVar32;
  uVar43 = (uVar43 << 10 | uVar43 >> 0x36) ^ uVar29;
  uVar42 = uVar42 + uVar31;
  uVar32 = (uVar32 << 0x11 | uVar32 >> 0x2f) ^ uVar45;
  uVar29 = uVar29 + uVar32;
  uVar31 = (uVar31 << 0x19 | uVar31 >> 0x27) ^ uVar42;
  uVar45 = uVar45 + uVar43;
  uVar32 = (uVar32 << 0x1d | uVar32 >> 0x23) ^ uVar29;
  uVar50 = uVar50 + uVar23;
  uVar43 = (uVar43 << 0x27 | uVar43 >> 0x19) ^ uVar45;
  uVar29 = uVar29 + uVar31;
  uVar23 = (uVar23 << 0x2b | uVar23 >> 0x15) ^ uVar50;
  uVar45 = uVar45 + uVar23;
  uVar50 = uVar50 + uVar43;
  uVar42 = uVar42 + uVar32;
  uVar31 = ((uVar31 << 8 | uVar31 >> 0x38) ^ uVar29) + uVar18;
  uVar44 = uVar45 + uVar17 + uVar31;
  uVar32 = ((uVar32 << 0x16 | uVar32 >> 0x2a) ^ uVar42) + uVar3;
  uVar49 = uVar50 + uVar19 + uVar32;
  uVar31 = (uVar31 << 0x2e | uVar31 >> 0x12) ^ uVar44;
  uVar32 = (uVar32 << 0x24 | uVar32 >> 0x1c) ^ uVar49;
  uVar43 = ((uVar43 << 0x38 | uVar43 >> 8) ^ uVar50) + lVar27;
  uVar42 = uVar42 + uVar12 + uVar43;
  uVar43 = (uVar43 * 0x80000 | uVar43 >> 0x2d) ^ uVar42;
  uVar23 = ((uVar23 << 0x23 | uVar23 >> 0x1d) ^ uVar45) + uVar15 + 6;
  lVar26 = uVar21 + uVar14;
  uVar29 = uVar29 + lVar26 + uVar23;
  uVar23 = (uVar23 << 0x25 | uVar23 >> 0x1b) ^ uVar29;
  uVar49 = uVar49 + uVar31;
  uVar31 = (uVar31 << 0x21 | uVar31 >> 0x1f) ^ uVar49;
  uVar42 = uVar42 + uVar23;
  uVar23 = (uVar23 << 0x1b | uVar23 >> 0x25) ^ uVar42;
  uVar29 = uVar29 + uVar43;
  uVar43 = (uVar43 << 0xe | uVar43 >> 0x32) ^ uVar29;
  uVar44 = uVar44 + uVar32;
  uVar32 = (uVar32 << 0x2a | uVar32 >> 0x16) ^ uVar44;
  uVar42 = uVar42 + uVar31;
  uVar31 = (uVar31 << 0x11 | uVar31 >> 0x2f) ^ uVar42;
  uVar29 = uVar29 + uVar32;
  uVar32 = (uVar32 << 0x31 | uVar32 >> 0xf) ^ uVar29;
  uVar44 = uVar44 + uVar43;
  uVar43 = (uVar43 << 0x24 | uVar43 >> 0x1c) ^ uVar44;
  uVar49 = uVar49 + uVar23;
  uVar23 = (uVar23 << 0x27 | uVar23 >> 0x19) ^ uVar49;
  uVar29 = uVar29 + uVar31;
  uVar44 = uVar44 + uVar23;
  uVar49 = uVar49 + uVar43;
  uVar42 = uVar42 + uVar32;
  uVar31 = ((uVar31 << 0x2c | uVar31 >> 0x14) ^ uVar29) + uVar19;
  uVar45 = uVar44 + uVar18 + uVar31;
  uVar31 = (uVar31 << 0x27 | uVar31 >> 0x19) ^ uVar45;
  uVar32 = ((uVar32 << 0x38 | uVar32 >> 8) ^ uVar42) + uVar12;
  uVar50 = uVar49 + uVar3 + uVar32;
  uVar32 = (uVar32 * 0x40000000 | uVar32 >> 0x22) ^ uVar50;
  uVar43 = ((uVar43 << 0x36 | uVar43 >> 10) ^ uVar49) + lVar26;
  uVar42 = uVar42 + uVar13 + uVar43;
  uVar43 = (uVar43 << 0x22 | uVar43 >> 0x1e) ^ uVar42;
  uVar23 = ((uVar23 << 9 | uVar23 >> 0x37) ^ uVar44) + uVar16 + 7;
  lVar38 = uVar22 + uVar15;
  uVar29 = uVar29 + lVar38 + uVar23;
  uVar23 = (uVar23 * 0x1000000 | uVar23 >> 0x28) ^ uVar29;
  uVar50 = uVar50 + uVar31;
  uVar31 = (uVar31 << 0xd | uVar31 >> 0x33) ^ uVar50;
  uVar42 = uVar42 + uVar23;
  uVar23 = (uVar23 << 0x32 | uVar23 >> 0xe) ^ uVar42;
  uVar29 = uVar29 + uVar43;
  uVar43 = (uVar43 << 10 | uVar43 >> 0x36) ^ uVar29;
  uVar45 = uVar45 + uVar32;
  uVar32 = (uVar32 << 0x11 | uVar32 >> 0x2f) ^ uVar45;
  uVar42 = uVar42 + uVar31;
  uVar31 = (uVar31 << 0x19 | uVar31 >> 0x27) ^ uVar42;
  uVar29 = uVar29 + uVar32;
  uVar32 = (uVar32 << 0x1d | uVar32 >> 0x23) ^ uVar29;
  uVar45 = uVar45 + uVar43;
  uVar43 = (uVar43 << 0x27 | uVar43 >> 0x19) ^ uVar45;
  uVar50 = uVar50 + uVar23;
  uVar23 = (uVar23 << 0x2b | uVar23 >> 0x15) ^ uVar50;
  uVar29 = uVar29 + uVar31;
  uVar45 = uVar45 + uVar23;
  uVar50 = uVar50 + uVar43;
  uVar42 = uVar42 + uVar32;
  uVar31 = ((uVar31 << 8 | uVar31 >> 0x38) ^ uVar29) + uVar3;
  uVar44 = uVar45 + uVar19 + uVar31;
  uVar31 = (uVar31 << 0x2e | uVar31 >> 0x12) ^ uVar44;
  uVar32 = ((uVar32 << 0x16 | uVar32 >> 0x2a) ^ uVar42) + uVar13;
  uVar49 = uVar50 + uVar12 + uVar32;
  uVar43 = ((uVar43 << 0x38 | uVar43 >> 8) ^ uVar50) + lVar38;
  uVar42 = uVar42 + uVar14 + uVar43;
  uVar32 = (uVar32 << 0x24 | uVar32 >> 0x1c) ^ uVar49;
  uVar43 = (uVar43 * 0x80000 | uVar43 >> 0x2d) ^ uVar42;
  uVar23 = ((uVar23 << 0x23 | uVar23 >> 0x1d) ^ uVar45) + uVar17 + 8;
  uVar29 = uVar29 + lVar28 + uVar23;
  uVar23 = (uVar23 << 0x25 | uVar23 >> 0x1b) ^ uVar29;
  uVar49 = uVar49 + uVar31;
  uVar31 = (uVar31 << 0x21 | uVar31 >> 0x1f) ^ uVar49;
  uVar42 = uVar42 + uVar23;
  uVar23 = (uVar23 << 0x1b | uVar23 >> 0x25) ^ uVar42;
  uVar29 = uVar29 + uVar43;
  uVar43 = (uVar43 << 0xe | uVar43 >> 0x32) ^ uVar29;
  uVar44 = uVar44 + uVar32;
  uVar32 = (uVar32 << 0x2a | uVar32 >> 0x16) ^ uVar44;
  uVar42 = uVar42 + uVar31;
  uVar31 = (uVar31 << 0x11 | uVar31 >> 0x2f) ^ uVar42;
  uVar29 = uVar29 + uVar32;
  uVar32 = (uVar32 << 0x31 | uVar32 >> 0xf) ^ uVar29;
  uVar44 = uVar44 + uVar43;
  uVar43 = (uVar43 << 0x24 | uVar43 >> 0x1c) ^ uVar44;
  uVar49 = uVar49 + uVar23;
  uVar23 = (uVar23 << 0x27 | uVar23 >> 0x19) ^ uVar49;
  uVar29 = uVar29 + uVar31;
  uVar44 = uVar44 + uVar23;
  uVar49 = uVar49 + uVar43;
  uVar42 = uVar42 + uVar32;
  uVar31 = ((uVar31 << 0x2c | uVar31 >> 0x14) ^ uVar29) + uVar12;
  uVar45 = uVar44 + uVar3 + uVar31;
  uVar31 = (uVar31 << 0x27 | uVar31 >> 0x19) ^ uVar45;
  uVar32 = ((uVar32 << 0x38 | uVar32 >> 8) ^ uVar42) + uVar14;
  uVar50 = uVar49 + uVar13 + uVar32;
  uVar43 = ((uVar43 << 0x36 | uVar43 >> 10) ^ uVar49) + lVar28;
  uVar42 = uVar42 + uVar15 + uVar43;
  uVar32 = (uVar32 * 0x40000000 | uVar32 >> 0x22) ^ uVar50;
  uVar43 = (uVar43 << 0x22 | uVar43 >> 0x1e) ^ uVar42;
  uVar23 = ((uVar23 << 9 | uVar23 >> 0x37) ^ uVar44) + uVar18 + 9;
  uVar29 = uVar29 + lVar1 + uVar23;
  uVar23 = (uVar23 * 0x1000000 | uVar23 >> 0x28) ^ uVar29;
  uVar50 = uVar50 + uVar31;
  uVar31 = (uVar31 << 0xd | uVar31 >> 0x33) ^ uVar50;
  uVar42 = uVar42 + uVar23;
  uVar23 = (uVar23 << 0x32 | uVar23 >> 0xe) ^ uVar42;
  uVar29 = uVar29 + uVar43;
  uVar43 = (uVar43 << 10 | uVar43 >> 0x36) ^ uVar29;
  uVar45 = uVar45 + uVar32;
  uVar32 = (uVar32 << 0x11 | uVar32 >> 0x2f) ^ uVar45;
  uVar42 = uVar42 + uVar31;
  uVar31 = (uVar31 << 0x19 | uVar31 >> 0x27) ^ uVar42;
  uVar29 = uVar29 + uVar32;
  uVar32 = (uVar32 << 0x1d | uVar32 >> 0x23) ^ uVar29;
  uVar45 = uVar45 + uVar43;
  uVar43 = (uVar43 << 0x27 | uVar43 >> 0x19) ^ uVar45;
  uVar50 = uVar50 + uVar23;
  uVar23 = (uVar23 << 0x2b | uVar23 >> 0x15) ^ uVar50;
  uVar29 = uVar29 + uVar31;
  uVar45 = uVar45 + uVar23;
  uVar50 = uVar50 + uVar43;
  uVar42 = uVar42 + uVar32;
  uVar31 = ((uVar31 << 8 | uVar31 >> 0x38) ^ uVar29) + uVar13;
  uVar44 = uVar45 + uVar12 + uVar31;
  uVar31 = (uVar31 << 0x2e | uVar31 >> 0x12) ^ uVar44;
  uVar32 = ((uVar32 << 0x16 | uVar32 >> 0x2a) ^ uVar42) + uVar15;
  uVar49 = uVar50 + uVar14 + uVar32;
  uVar43 = ((uVar43 << 0x38 | uVar43 >> 8) ^ uVar50) + lVar1;
  uVar42 = uVar42 + uVar16 + uVar43;
  uVar32 = (uVar32 << 0x24 | uVar32 >> 0x1c) ^ uVar49;
  uVar43 = (uVar43 * 0x80000 | uVar43 >> 0x2d) ^ uVar42;
  uVar23 = ((uVar23 << 0x23 | uVar23 >> 0x1d) ^ uVar45) + uVar19 + 10;
  uVar29 = uVar29 + lVar24 + uVar23;
  uVar23 = (uVar23 << 0x25 | uVar23 >> 0x1b) ^ uVar29;
  uVar49 = uVar49 + uVar31;
  uVar31 = (uVar31 << 0x21 | uVar31 >> 0x1f) ^ uVar49;
  uVar42 = uVar42 + uVar23;
  uVar23 = (uVar23 << 0x1b | uVar23 >> 0x25) ^ uVar42;
  uVar29 = uVar29 + uVar43;
  uVar43 = (uVar43 << 0xe | uVar43 >> 0x32) ^ uVar29;
  uVar44 = uVar44 + uVar32;
  uVar32 = (uVar32 << 0x2a | uVar32 >> 0x16) ^ uVar44;
  uVar44 = uVar44 + uVar43;
  uVar43 = (uVar43 << 0x24 | uVar43 >> 0x1c) ^ uVar44;
  uVar49 = uVar49 + uVar23;
  uVar23 = (uVar23 << 0x27 | uVar23 >> 0x19) ^ uVar49;
  uVar49 = uVar49 + uVar43;
  uVar43 = ((uVar43 << 0x36 | uVar43 >> 10) ^ uVar49) + lVar24;
  uVar42 = uVar42 + uVar31;
  uVar31 = (uVar31 << 0x11 | uVar31 >> 0x2f) ^ uVar42;
  uVar29 = uVar29 + uVar32;
  uVar32 = (uVar32 << 0x31 | uVar32 >> 0xf) ^ uVar29;
  uVar29 = uVar29 + uVar31;
  uVar44 = uVar44 + uVar23;
  uVar42 = uVar42 + uVar32;
  uVar31 = ((uVar31 << 0x2c | uVar31 >> 0x14) ^ uVar29) + uVar14;
  uVar45 = uVar44 + uVar13 + uVar31;
  uVar31 = (uVar31 << 0x27 | uVar31 >> 0x19) ^ uVar45;
  uVar32 = ((uVar32 << 0x38 | uVar32 >> 8) ^ uVar42) + uVar16;
  uVar49 = uVar49 + uVar15 + uVar32;
  uVar42 = uVar42 + uVar17 + uVar43;
  uVar32 = (uVar32 * 0x40000000 | uVar32 >> 0x22) ^ uVar49;
  uVar43 = (uVar43 << 0x22 | uVar43 >> 0x1e) ^ uVar42;
  uVar23 = ((uVar23 << 9 | uVar23 >> 0x37) ^ uVar44) + uVar3 + 0xb;
  uVar29 = uVar29 + lVar25 + uVar23;
  uVar23 = (uVar23 * 0x1000000 | uVar23 >> 0x28) ^ uVar29;
  uVar49 = uVar49 + uVar31;
  uVar31 = (uVar31 << 0xd | uVar31 >> 0x33) ^ uVar49;
  uVar42 = uVar42 + uVar23;
  uVar23 = (uVar23 << 0x32 | uVar23 >> 0xe) ^ uVar42;
  uVar29 = uVar29 + uVar43;
  uVar43 = (uVar43 << 10 | uVar43 >> 0x36) ^ uVar29;
  uVar45 = uVar45 + uVar32;
  uVar32 = (uVar32 << 0x11 | uVar32 >> 0x2f) ^ uVar45;
  uVar45 = uVar45 + uVar43;
  uVar43 = (uVar43 << 0x27 | uVar43 >> 0x19) ^ uVar45;
  uVar49 = uVar49 + uVar23;
  uVar23 = (uVar23 << 0x2b | uVar23 >> 0x15) ^ uVar49;
  uVar49 = uVar49 + uVar43;
  uVar43 = ((uVar43 << 0x38 | uVar43 >> 8) ^ uVar49) + lVar25;
  uVar42 = uVar42 + uVar31;
  uVar31 = (uVar31 << 0x19 | uVar31 >> 0x27) ^ uVar42;
  uVar29 = uVar29 + uVar32;
  uVar32 = (uVar32 << 0x1d | uVar32 >> 0x23) ^ uVar29;
  uVar29 = uVar29 + uVar31;
  uVar45 = uVar45 + uVar23;
  uVar42 = uVar42 + uVar32;
  uVar31 = ((uVar31 << 8 | uVar31 >> 0x38) ^ uVar29) + uVar15;
  uVar44 = uVar45 + uVar14 + uVar31;
  uVar31 = (uVar31 << 0x2e | uVar31 >> 0x12) ^ uVar44;
  uVar32 = ((uVar32 << 0x16 | uVar32 >> 0x2a) ^ uVar42) + uVar17;
  uVar49 = uVar49 + uVar16 + uVar32;
  uVar42 = uVar42 + uVar18 + uVar43;
  uVar32 = (uVar32 << 0x24 | uVar32 >> 0x1c) ^ uVar49;
  uVar43 = (uVar43 * 0x80000 | uVar43 >> 0x2d) ^ uVar42;
  uVar23 = ((uVar23 << 0x23 | uVar23 >> 0x1d) ^ uVar45) + uVar12 + 0xc;
  uVar29 = uVar29 + lVar33 + uVar23;
  uVar23 = (uVar23 << 0x25 | uVar23 >> 0x1b) ^ uVar29;
  uVar49 = uVar49 + uVar31;
  uVar31 = (uVar31 << 0x21 | uVar31 >> 0x1f) ^ uVar49;
  uVar42 = uVar42 + uVar23;
  uVar23 = (uVar23 << 0x1b | uVar23 >> 0x25) ^ uVar42;
  uVar29 = uVar29 + uVar43;
  uVar43 = (uVar43 << 0xe | uVar43 >> 0x32) ^ uVar29;
  uVar44 = uVar44 + uVar32;
  uVar32 = (uVar32 << 0x2a | uVar32 >> 0x16) ^ uVar44;
  uVar44 = uVar44 + uVar43;
  uVar43 = (uVar43 << 0x24 | uVar43 >> 0x1c) ^ uVar44;
  uVar49 = uVar49 + uVar23;
  uVar23 = (uVar23 << 0x27 | uVar23 >> 0x19) ^ uVar49;
  uVar49 = uVar49 + uVar43;
  uVar43 = ((uVar43 << 0x36 | uVar43 >> 10) ^ uVar49) + lVar33;
  uVar42 = uVar42 + uVar31;
  uVar31 = (uVar31 << 0x11 | uVar31 >> 0x2f) ^ uVar42;
  uVar29 = uVar29 + uVar32;
  uVar32 = (uVar32 << 0x31 | uVar32 >> 0xf) ^ uVar29;
  uVar29 = uVar29 + uVar31;
  uVar44 = uVar44 + uVar23;
  uVar42 = uVar42 + uVar32;
  uVar31 = ((uVar31 << 0x2c | uVar31 >> 0x14) ^ uVar29) + uVar16;
  uVar45 = uVar44 + uVar15 + uVar31;
  uVar31 = (uVar31 << 0x27 | uVar31 >> 0x19) ^ uVar45;
  uVar32 = ((uVar32 << 0x38 | uVar32 >> 8) ^ uVar42) + uVar18;
  uVar49 = uVar49 + uVar17 + uVar32;
  uVar42 = uVar42 + uVar19 + uVar43;
  uVar32 = (uVar32 * 0x40000000 | uVar32 >> 0x22) ^ uVar49;
  uVar43 = (uVar43 << 0x22 | uVar43 >> 0x1e) ^ uVar42;
  uVar23 = ((uVar23 << 9 | uVar23 >> 0x37) ^ uVar44) + uVar13 + 0xd;
  uVar29 = uVar29 + lVar2 + uVar23;
  uVar23 = (uVar23 * 0x1000000 | uVar23 >> 0x28) ^ uVar29;
  uVar49 = uVar49 + uVar31;
  uVar31 = (uVar31 << 0xd | uVar31 >> 0x33) ^ uVar49;
  uVar42 = uVar42 + uVar23;
  uVar23 = (uVar23 << 0x32 | uVar23 >> 0xe) ^ uVar42;
  uVar29 = uVar29 + uVar43;
  uVar43 = (uVar43 << 10 | uVar43 >> 0x36) ^ uVar29;
  uVar45 = uVar45 + uVar32;
  uVar32 = (uVar32 << 0x11 | uVar32 >> 0x2f) ^ uVar45;
  uVar45 = uVar45 + uVar43;
  uVar43 = (uVar43 << 0x27 | uVar43 >> 0x19) ^ uVar45;
  uVar49 = uVar49 + uVar23;
  uVar23 = (uVar23 << 0x2b | uVar23 >> 0x15) ^ uVar49;
  uVar49 = uVar49 + uVar43;
  uVar43 = ((uVar43 << 0x38 | uVar43 >> 8) ^ uVar49) + lVar2;
  uVar42 = uVar42 + uVar31;
  uVar31 = (uVar31 << 0x19 | uVar31 >> 0x27) ^ uVar42;
  uVar29 = uVar29 + uVar32;
  uVar32 = (uVar32 << 0x1d | uVar32 >> 0x23) ^ uVar29;
  uVar29 = uVar29 + uVar31;
  uVar45 = uVar45 + uVar23;
  uVar42 = uVar42 + uVar32;
  uVar31 = ((uVar31 << 8 | uVar31 >> 0x38) ^ uVar29) + uVar17;
  uVar44 = uVar45 + uVar16 + uVar31;
  uVar31 = (uVar31 << 0x2e | uVar31 >> 0x12) ^ uVar44;
  uVar32 = ((uVar32 << 0x16 | uVar32 >> 0x2a) ^ uVar42) + uVar19;
  uVar49 = uVar49 + uVar18 + uVar32;
  uVar42 = uVar42 + uVar3 + uVar43;
  uVar32 = (uVar32 << 0x24 | uVar32 >> 0x1c) ^ uVar49;
  uVar43 = (uVar43 * 0x80000 | uVar43 >> 0x2d) ^ uVar42;
  uVar23 = ((uVar23 << 0x23 | uVar23 >> 0x1d) ^ uVar45) + uVar14 + 0xe;
  uVar29 = uVar29 + lVar27 + uVar23;
  uVar23 = (uVar23 << 0x25 | uVar23 >> 0x1b) ^ uVar29;
  uVar49 = uVar49 + uVar31;
  uVar31 = (uVar31 << 0x21 | uVar31 >> 0x1f) ^ uVar49;
  uVar42 = uVar42 + uVar23;
  uVar23 = (uVar23 << 0x1b | uVar23 >> 0x25) ^ uVar42;
  uVar29 = uVar29 + uVar43;
  uVar43 = (uVar43 << 0xe | uVar43 >> 0x32) ^ uVar29;
  uVar44 = uVar44 + uVar32;
  uVar32 = (uVar32 << 0x2a | uVar32 >> 0x16) ^ uVar44;
  uVar44 = uVar44 + uVar43;
  uVar43 = (uVar43 << 0x24 | uVar43 >> 0x1c) ^ uVar44;
  uVar49 = uVar49 + uVar23;
  uVar23 = (uVar23 << 0x27 | uVar23 >> 0x19) ^ uVar49;
  uVar49 = uVar49 + uVar43;
  uVar43 = ((uVar43 << 0x36 | uVar43 >> 10) ^ uVar49) + lVar27;
  uVar42 = uVar42 + uVar31;
  uVar31 = (uVar31 << 0x11 | uVar31 >> 0x2f) ^ uVar42;
  uVar29 = uVar29 + uVar32;
  uVar32 = (uVar32 << 0x31 | uVar32 >> 0xf) ^ uVar29;
  uVar29 = uVar29 + uVar31;
  uVar44 = uVar44 + uVar23;
  uVar42 = uVar42 + uVar32;
  uVar31 = ((uVar31 << 0x2c | uVar31 >> 0x14) ^ uVar29) + uVar18;
  uVar45 = uVar44 + uVar17 + uVar31;
  uVar31 = (uVar31 << 0x27 | uVar31 >> 0x19) ^ uVar45;
  uVar32 = ((uVar32 << 0x38 | uVar32 >> 8) ^ uVar42) + uVar3;
  uVar49 = uVar49 + uVar19 + uVar32;
  uVar42 = uVar42 + uVar12 + uVar43;
  uVar32 = (uVar32 * 0x40000000 | uVar32 >> 0x22) ^ uVar49;
  uVar43 = (uVar43 << 0x22 | uVar43 >> 0x1e) ^ uVar42;
  uVar23 = ((uVar23 << 9 | uVar23 >> 0x37) ^ uVar44) + uVar15 + 0xf;
  uVar29 = uVar29 + lVar26 + uVar23;
  uVar23 = (uVar23 * 0x1000000 | uVar23 >> 0x28) ^ uVar29;
  uVar49 = uVar49 + uVar31;
  uVar31 = (uVar31 << 0xd | uVar31 >> 0x33) ^ uVar49;
  uVar42 = uVar42 + uVar23;
  uVar23 = (uVar23 << 0x32 | uVar23 >> 0xe) ^ uVar42;
  uVar29 = uVar29 + uVar43;
  uVar43 = (uVar43 << 10 | uVar43 >> 0x36) ^ uVar29;
  uVar45 = uVar45 + uVar32;
  uVar32 = (uVar32 << 0x11 | uVar32 >> 0x2f) ^ uVar45;
  uVar45 = uVar45 + uVar43;
  uVar43 = (uVar43 << 0x27 | uVar43 >> 0x19) ^ uVar45;
  uVar49 = uVar49 + uVar23;
  uVar23 = (uVar23 << 0x2b | uVar23 >> 0x15) ^ uVar49;
  uVar49 = uVar49 + uVar43;
  uVar43 = ((uVar43 << 0x38 | uVar43 >> 8) ^ uVar49) + lVar26;
  uVar42 = uVar42 + uVar31;
  uVar31 = (uVar31 << 0x19 | uVar31 >> 0x27) ^ uVar42;
  uVar29 = uVar29 + uVar32;
  uVar32 = (uVar32 << 0x1d | uVar32 >> 0x23) ^ uVar29;
  uVar29 = uVar29 + uVar31;
  uVar45 = uVar45 + uVar23;
  uVar23 = ((uVar23 << 0x23 | uVar23 >> 0x1d) ^ uVar45) + uVar16 + 0x10;
  uVar42 = uVar42 + uVar32;
  uVar31 = ((uVar31 << 8 | uVar31 >> 0x38) ^ uVar29) + uVar19;
  uVar44 = uVar45 + uVar18 + uVar31;
  uVar32 = ((uVar32 << 0x16 | uVar32 >> 0x2a) ^ uVar42) + uVar12;
  uVar45 = uVar49 + uVar3 + uVar32;
  uVar31 = (uVar31 << 0x2e | uVar31 >> 0x12) ^ uVar44;
  uVar32 = (uVar32 << 0x24 | uVar32 >> 0x1c) ^ uVar45;
  uVar42 = uVar42 + uVar13 + uVar43;
  uVar43 = (uVar43 * 0x80000 | uVar43 >> 0x2d) ^ uVar42;
  uVar29 = uVar29 + lVar38 + uVar23;
  uVar23 = (uVar23 << 0x25 | uVar23 >> 0x1b) ^ uVar29;
  uVar45 = uVar45 + uVar31;
  uVar31 = (uVar31 << 0x21 | uVar31 >> 0x1f) ^ uVar45;
  uVar42 = uVar42 + uVar23;
  uVar23 = (uVar23 << 0x1b | uVar23 >> 0x25) ^ uVar42;
  uVar29 = uVar29 + uVar43;
  uVar43 = (uVar43 << 0xe | uVar43 >> 0x32) ^ uVar29;
  uVar44 = uVar44 + uVar32;
  uVar32 = (uVar32 << 0x2a | uVar32 >> 0x16) ^ uVar44;
  uVar44 = uVar44 + uVar43;
  uVar43 = (uVar43 << 0x24 | uVar43 >> 0x1c) ^ uVar44;
  uVar45 = uVar45 + uVar23;
  uVar23 = (uVar23 << 0x27 | uVar23 >> 0x19) ^ uVar45;
  uVar44 = uVar44 + uVar23;
  uVar45 = uVar45 + uVar43;
  uVar43 = ((uVar43 << 0x36 | uVar43 >> 10) ^ uVar45) + lVar38;
  uVar23 = ((uVar23 << 9 | uVar23 >> 0x37) ^ uVar44) + uVar17 + 0x11;
  uVar42 = uVar42 + uVar31;
  uVar31 = (uVar31 << 0x11 | uVar31 >> 0x2f) ^ uVar42;
  uVar29 = uVar29 + uVar32;
  uVar32 = (uVar32 << 0x31 | uVar32 >> 0xf) ^ uVar29;
  uVar29 = uVar29 + uVar31;
  uVar42 = uVar42 + uVar32;
  uVar31 = ((uVar31 << 0x2c | uVar31 >> 0x14) ^ uVar29) + uVar3;
  uVar44 = uVar44 + uVar19 + uVar31;
  uVar32 = ((uVar32 << 0x38 | uVar32 >> 8) ^ uVar42) + uVar13;
  uVar45 = uVar45 + uVar12 + uVar32;
  uVar31 = (uVar31 << 0x27 | uVar31 >> 0x19) ^ uVar44;
  uVar32 = (uVar32 * 0x40000000 | uVar32 >> 0x22) ^ uVar45;
  uVar42 = uVar42 + uVar14 + uVar43;
  uVar43 = (uVar43 << 0x22 | uVar43 >> 0x1e) ^ uVar42;
  uVar29 = uVar29 + lVar28 + uVar23;
  uVar23 = (uVar23 * 0x1000000 | uVar23 >> 0x28) ^ uVar29;
  uVar45 = uVar45 + uVar31;
  uVar31 = (uVar31 << 0xd | uVar31 >> 0x33) ^ uVar45;
  uVar42 = uVar42 + uVar23;
  uVar23 = (uVar23 << 0x32 | uVar23 >> 0xe) ^ uVar42;
  uVar29 = uVar29 + uVar43;
  uVar43 = (uVar43 << 10 | uVar43 >> 0x36) ^ uVar29;
  uVar44 = uVar44 + uVar32;
  uVar32 = (uVar32 << 0x11 | uVar32 >> 0x2f) ^ uVar44;
  uVar44 = uVar44 + uVar43;
  uVar43 = (uVar43 << 0x27 | uVar43 >> 0x19) ^ uVar44;
  uVar45 = uVar45 + uVar23;
  uVar23 = (uVar23 << 0x2b | uVar23 >> 0x15) ^ uVar45;
  uVar44 = uVar44 + uVar23;
  uVar42 = uVar42 + uVar31;
  uVar31 = (uVar31 << 0x19 | uVar31 >> 0x27) ^ uVar42;
  uVar29 = uVar29 + uVar32;
  uVar32 = (uVar32 << 0x1d | uVar32 >> 0x23) ^ uVar29;
  uVar29 = uVar29 + uVar31;
  *out = uVar44 + uVar3;
  out[1] = ((uVar31 << 8 | uVar31 >> 0x38) ^ uVar29) + uVar12;
  uVar45 = uVar45 + uVar43;
  uVar42 = uVar42 + uVar32;
  out[2] = uVar45 + uVar13;
  out[3] = ((uVar32 << 0x16 | uVar32 >> 0x2a) ^ uVar42) + uVar14;
  out[4] = uVar42 + uVar15;
  out[5] = ((uVar43 << 0x38 | uVar43 >> 8) ^ uVar45) + lVar28;
  out[6] = uVar29 + lVar1;
  out[7] = ((uVar23 << 0x23 | uVar23 >> 0x1d) ^ uVar44) + uVar18 + 0x12;
  return;
}

Assistant:

void threefishEncryptBlockWords(ThreefishKey_t* keyCtx, uint64_t* in,
                                uint64_t* out)
{
    switch (keyCtx->stateSize) {
        case Threefish256:
            threefishEncrypt256(keyCtx, in, out);
            break;
        case Threefish512:
            threefishEncrypt512(keyCtx, in, out);
            break;
        case Threefish1024:
            threefishEncrypt1024(keyCtx, in, out);
            break;
    }
}